

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  unsigned_short *puVar2;
  undefined4 uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int *piVar13;
  void *pvVar14;
  undefined4 *puVar15;
  void *pvVar16;
  size_t sVar17;
  uint *puVar18;
  float *pfVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  ulong uVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [32];
  undefined1 (*pauVar35) [32];
  long lVar36;
  long lVar37;
  long lVar38;
  undefined1 (*pauVar39) [16];
  int iVar40;
  long lVar41;
  undefined1 (*pauVar42) [16];
  long lVar43;
  long lVar44;
  undefined1 (*pauVar45) [16];
  long lVar46;
  undefined1 (*pauVar47) [16];
  int iVar48;
  long lVar49;
  long lVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar70 [32];
  float fVar72;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar71 [64];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  __m128 pos;
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar112 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar114 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar125 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar167;
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar206 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar295 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [64];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [64];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [64];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  long local_360;
  undefined1 (*local_358) [32];
  int *piStack_350;
  size_t local_348;
  int local_340;
  Allocator *local_338;
  int local_330;
  int local_32c;
  undefined8 local_328;
  int local_320;
  size_t local_318;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined1 local_288 [32];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  undefined1 local_208 [16];
  float local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  ulong local_1a0;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  Option opt_flatten;
  undefined1 auVar61 [32];
  undefined1 auVar64 [32];
  undefined1 auVar69 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar104 [32];
  
  local_330 = bottom_blob->dims;
  if (local_330 == 2) {
    iVar31 = (this->super_InnerProduct).num_output;
    local_32c = bottom_blob->w;
    if (local_32c == (this->super_InnerProduct).weight_data_size / iVar31) {
      Mat::create(top_blob,iVar31,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,opt);
      return 0;
    }
  }
  else {
    local_32c = bottom_blob->w;
  }
  piVar13 = bottom_blob->refcount;
  local_358 = (undefined1 (*) [32])bottom_blob->data;
  piStack_350 = bottom_blob->refcount;
  local_348 = bottom_blob->elemsize;
  local_340 = bottom_blob->elempack;
  local_338 = bottom_blob->allocator;
  local_328._0_4_ = bottom_blob->h;
  local_328._4_4_ = bottom_blob->d;
  local_320 = bottom_blob->c;
  local_318 = bottom_blob->cstep;
  iVar31 = local_330;
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + 1;
    UNLOCK();
    iVar31 = bottom_blob->dims;
  }
  iVar48 = -100;
  if (iVar31 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.vulkan_device_index = opt->vulkan_device_index;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
    opt_flatten.use_int8_uniform = opt->use_int8_uniform;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_358);
    if ((local_358 == (undefined1 (*) [32])0x0) || ((long)local_320 * local_318 == 0))
    goto LAB_002c44fa;
  }
  uVar12 = (this->super_InnerProduct).num_output;
  if (opt->use_packing_layout == true) {
    uVar29 = 8;
    if ((uVar12 & 7) != 0) {
      uVar29 = (uint)((uVar12 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar29 = 1;
  }
  Mat::create(top_blob,(int)uVar12 / (int)uVar29,
              (ulong)uVar29 * (local_348 / (ulong)(long)local_340),uVar29,opt->blob_allocator);
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar31 = (this->super_InnerProduct).activation_type;
    iVar28 = local_340 * local_32c;
    iVar48 = top_blob->elempack;
    uVar12 = top_blob->w;
    uVar33 = (ulong)uVar12;
    pvVar14 = (this->super_InnerProduct).bias_data.data;
    if (iVar48 == 1) {
      local_360 = 0;
      local_1a0 = (ulong)(uint)((int)uVar12 >> 3);
      if ((int)uVar12 >> 3 < 1) {
        local_1a0 = 0;
      }
      lVar38 = 1;
      lVar43 = 2;
      lVar41 = 3;
      lVar44 = 4;
      lVar46 = 5;
      lVar49 = 6;
      lVar37 = 7;
      for (uVar33 = 0; pauVar35 = local_358, uVar33 != local_1a0; uVar33 = uVar33 + 1) {
        local_308 = uVar33 * 8;
        auVar74 = ZEXT816(0) << 0x40;
        local_1e8._8_8_ = 0;
        local_1e8._0_8_ = 0;
        local_1e8._16_8_ = 0;
        local_1e8._24_8_ = 0;
        if (pvVar14 != (void *)0x0) {
          puVar1 = (undefined8 *)((long)pvVar14 + uVar33 * 0x20);
          local_1e8._0_8_ = *puVar1;
          local_1e8._8_8_ = puVar1[1];
          local_1e8._16_8_ = puVar1[2];
          local_1e8._24_8_ = puVar1[3];
        }
        pvVar16 = (this->weight_data_tm).data;
        sVar17 = (this->weight_data_tm).elemsize;
        lVar30 = (long)(this->weight_data_tm).w;
        lVar50 = 0;
        lVar36 = 0;
        auVar112 = ZEXT816(0) << 0x40;
        auVar76 = ZEXT816(0) << 0x40;
        auVar80 = ZEXT816(0) << 0x40;
        auVar202 = ZEXT816(0) << 0x40;
        auVar113 = ZEXT816(0) << 0x40;
        local_288._0_16_ = ZEXT816(0);
        local_1c8._0_16_ = ZEXT816(0);
        iVar48 = 0;
        while( true ) {
          local_1c8 = ZEXT1632(local_1c8._0_16_);
          local_288 = ZEXT1632(local_288._0_16_);
          auVar362 = ZEXT1664(auVar113);
          auVar357 = ZEXT1664(auVar202);
          auVar352 = ZEXT1664(auVar80);
          auVar346 = ZEXT1664(auVar76);
          auVar294 = ZEXT1664(auVar112);
          auVar71 = ZEXT1664(auVar74);
          local_98 = ZEXT1632(auVar113);
          local_198 = ZEXT1632(auVar202);
          local_2c8 = ZEXT1632(auVar80);
          local_178 = ZEXT1632(auVar76);
          local_158 = ZEXT1632(auVar112);
          local_138 = ZEXT1632(auVar74);
          if (iVar28 <= iVar48 + 7) break;
          auVar66 = *(undefined1 (*) [32])(*local_358 + lVar36 * 2);
          auVar74 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar16 + lVar36 + sVar17 * local_360 * lVar30));
          auVar113 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar16 + lVar36 + sVar17 * lVar38 * lVar30));
          auVar202 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar16 + lVar36 + sVar17 * lVar43 * lVar30));
          auVar80 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar16 + lVar36 + sVar17 * lVar41 * lVar30));
          auVar76 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar16 + lVar36 + sVar17 * lVar44 * lVar30));
          auVar112 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar16 + lVar36 + sVar17 * lVar46 * lVar30));
          auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar16 + lVar36 + sVar17 * lVar49 * lVar30));
          auVar125 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar16 + lVar36 + sVar17 * lVar37 * lVar30));
          auVar63 = vcvtph2ps_f16c(auVar74);
          local_1c8._0_16_ = vfmadd231ps_fma(local_1c8,auVar66,auVar63);
          auVar63 = vcvtph2ps_f16c(auVar113);
          local_288._0_16_ = vfmadd231ps_fma(local_288,auVar66,auVar63);
          auVar63 = vcvtph2ps_f16c(auVar202);
          auVar113 = vfmadd231ps_fma(local_98,auVar66,auVar63);
          auVar63 = vcvtph2ps_f16c(auVar80);
          auVar202 = vfmadd231ps_fma(local_198,auVar66,auVar63);
          auVar63 = vcvtph2ps_f16c(auVar76);
          auVar111 = vcvtph2ps_f16c(auVar112);
          auVar67 = vcvtph2ps_f16c(auVar56);
          auVar165 = vcvtph2ps_f16c(auVar125);
          auVar80 = vfmadd231ps_fma(local_2c8,auVar66,auVar63);
          auVar76 = vfmadd231ps_fma(local_178,auVar66,auVar111);
          auVar112 = vfmadd231ps_fma(local_158,auVar66,auVar67);
          auVar74 = vfmadd231ps_fma(local_138,auVar66,auVar165);
          iVar48 = iVar48 + 8;
          lVar36 = lVar36 + 0x10;
          lVar50 = lVar50 + 8;
        }
        lVar30 = sVar17 * lVar30;
        auVar66 = local_1e8;
        local_300 = lVar37;
        local_2f8 = lVar49;
        local_2f0 = lVar46;
        local_2e8 = lVar44;
        local_2e0 = lVar41;
        local_2d8 = lVar43;
        local_2d0 = lVar38;
        for (; (int)lVar50 < iVar28; lVar50 = lVar50 + 1) {
          puVar2 = (unsigned_short *)((long)pvVar16 + lVar50 * 2 + lVar30 * local_360);
          uVar29 = *(uint *)(*pauVar35 + lVar50 * 4);
          local_1e8 = auVar66;
          local_1f8 = float16_to_float32(*puVar2);
          local_208 = ZEXT416(*(uint *)(*pauVar35 + lVar50 * 4));
          uStack_1f4 = extraout_XMM0_Db;
          uStack_1f0 = extraout_XMM0_Dc;
          uStack_1ec = extraout_XMM0_Dd;
          local_218 = float16_to_float32(*(unsigned_short *)((long)puVar2 + lVar30));
          local_228 = ZEXT416(*(uint *)(*pauVar35 + lVar50 * 4));
          fVar51 = float16_to_float32(puVar2[lVar30]);
          auVar66 = local_b8;
          local_b8._4_4_ = extraout_XMM0_Db_00;
          local_b8._0_4_ = fVar51;
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._16_16_ = auVar66._16_16_;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          local_d8._0_16_ = ZEXT416(*(uint *)(*pauVar35 + lVar50 * 4));
          fVar51 = float16_to_float32(*(unsigned_short *)((long)puVar2 + lVar30 * 3));
          auVar66 = local_f8;
          local_f8._4_4_ = extraout_XMM0_Db_01;
          local_f8._0_4_ = fVar51;
          local_f8._8_4_ = extraout_XMM0_Dc_01;
          local_f8._16_16_ = auVar66._16_16_;
          local_f8._12_4_ = extraout_XMM0_Dd_01;
          local_118._0_16_ = ZEXT416(*(uint *)(*pauVar35 + lVar50 * 4));
          local_238._0_4_ = float16_to_float32(puVar2[lVar30 * 2]);
          local_238._4_4_ = extraout_XMM0_Db_02;
          local_238._8_4_ = extraout_XMM0_Dc_02;
          local_238._12_4_ = extraout_XMM0_Dd_02;
          local_248 = ZEXT416(*(uint *)(*pauVar35 + lVar50 * 4));
          local_258._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar2 + lVar30 * 5));
          local_258._4_4_ = extraout_XMM0_Db_03;
          local_258._8_4_ = extraout_XMM0_Dc_03;
          local_258._12_4_ = extraout_XMM0_Dd_03;
          local_268 = ZEXT416(*(uint *)(*pauVar35 + lVar50 * 4));
          fVar51 = float16_to_float32(puVar2[lVar30 * 3]);
          local_298 = CONCAT44(extraout_XMM0_Db_04,fVar51);
          local_2a8 = ZEXT416(*(uint *)(*pauVar35 + lVar50 * 4));
          auVar71._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar2 + lVar30 * 7));
          auVar71._4_60_ = extraout_var;
          auVar74 = vinsertps_avx(local_238,ZEXT416((uint)local_258._0_4_),0x10);
          auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)local_298),0x20);
          auVar74 = vinsertps_avx(auVar74,auVar71._0_16_,0x30);
          auVar113._4_4_ = uStack_1f4;
          auVar113._0_4_ = local_1f8;
          auVar113._8_4_ = uStack_1f0;
          auVar113._12_4_ = uStack_1ec;
          auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)local_218),0x10);
          auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)local_b8._0_4_),0x20);
          auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)local_f8._0_4_),0x30);
          auVar66._16_16_ = auVar74;
          auVar66._0_16_ = auVar113;
          auVar74 = vinsertps_avx(local_118._0_16_,ZEXT416((uint)local_248._0_4_),0x10);
          auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)local_268._0_4_),0x20);
          auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)local_2a8._0_4_),0x30);
          auVar113 = vinsertps_avx(ZEXT416(uVar29),ZEXT416((uint)local_208._0_4_),0x10);
          auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)local_228._0_4_),0x20);
          auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)local_d8._0_4_),0x30);
          auVar63._16_16_ = auVar74;
          auVar63._0_16_ = auVar113;
          auVar74 = vfmadd231ps_fma(local_1e8,auVar66,auVar63);
          auVar66 = ZEXT1632(auVar74);
          auVar71 = ZEXT3264(local_138);
          auVar294 = ZEXT3264(local_158);
          auVar346 = ZEXT3264(local_178);
          auVar352 = ZEXT3264(local_2c8);
          auVar357 = ZEXT3264(local_198);
          auVar362 = ZEXT3264(local_98);
        }
        auVar63 = vhaddps_avx(local_1c8,local_288);
        auVar111 = vhaddps_avx(auVar362._0_32_,auVar357._0_32_);
        auVar111 = vhaddps_avx(auVar63,auVar111);
        auVar63 = vhaddps_avx(auVar352._0_32_,auVar346._0_32_);
        auVar67 = vhaddps_avx(auVar294._0_32_,auVar71._0_32_);
        auVar67 = vhaddps_avx(auVar63,auVar67);
        auVar63 = vblendps_avx(auVar111,auVar67,0xf0);
        auVar111 = vperm2f128_avx(auVar111,auVar67,0x21);
        fVar51 = auVar111._0_4_ + auVar66._0_4_ + auVar63._0_4_;
        fVar72 = auVar111._4_4_ + auVar66._4_4_ + auVar63._4_4_;
        auVar67._0_8_ = CONCAT44(fVar72,fVar51);
        auVar67._8_4_ = auVar111._8_4_ + auVar66._8_4_ + auVar63._8_4_;
        auVar67._12_4_ = auVar111._12_4_ + auVar66._12_4_ + auVar63._12_4_;
        auVar67._16_4_ = auVar111._16_4_ + auVar66._16_4_ + auVar63._16_4_;
        auVar67._20_4_ = auVar111._20_4_ + auVar66._20_4_ + auVar63._20_4_;
        auVar67._24_4_ = auVar111._24_4_ + auVar66._24_4_ + auVar63._24_4_;
        auVar67._28_4_ = auVar111._28_4_ + auVar66._28_4_ + auVar63._28_4_;
        if (5 < iVar31 - 1U) goto LAB_002c3967;
        auVar66 = vmaxps_avx(auVar67,ZEXT832(0) << 0x20);
        switch(iVar31) {
        case 2:
          auVar63 = vminps_avx(auVar67,ZEXT832(0) << 0x20);
          uVar3 = *(this->super_InnerProduct).activation_params.data;
          auVar155._4_4_ = uVar3;
          auVar155._0_4_ = uVar3;
          auVar155._8_4_ = uVar3;
          auVar155._12_4_ = uVar3;
          auVar155._16_4_ = uVar3;
          auVar155._20_4_ = uVar3;
          auVar155._24_4_ = uVar3;
          auVar155._28_4_ = uVar3;
          auVar74 = vfmadd231ps_fma(auVar66,auVar63,auVar155);
          auVar66 = ZEXT1632(auVar74);
          break;
        case 3:
          puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar3 = *puVar15;
          auVar106._4_4_ = uVar3;
          auVar106._0_4_ = uVar3;
          auVar106._8_4_ = uVar3;
          auVar106._12_4_ = uVar3;
          auVar106._16_4_ = uVar3;
          auVar106._20_4_ = uVar3;
          auVar106._24_4_ = uVar3;
          auVar106._28_4_ = uVar3;
          uVar3 = puVar15[1];
          auVar162._4_4_ = uVar3;
          auVar162._0_4_ = uVar3;
          auVar162._8_4_ = uVar3;
          auVar162._12_4_ = uVar3;
          auVar162._16_4_ = uVar3;
          auVar162._20_4_ = uVar3;
          auVar162._24_4_ = uVar3;
          auVar162._28_4_ = uVar3;
          auVar66 = vmaxps_avx(auVar67,auVar106);
          auVar66 = vminps_avx(auVar66,auVar162);
          break;
        case 4:
          auVar68._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
          auVar68._8_4_ = -auVar67._8_4_;
          auVar68._12_4_ = -auVar67._12_4_;
          auVar68._16_4_ = -auVar67._16_4_;
          auVar68._20_4_ = -auVar67._20_4_;
          auVar68._24_4_ = -auVar67._24_4_;
          auVar68._28_4_ = -auVar67._28_4_;
          auVar107._8_4_ = 0x42b0c0a5;
          auVar107._0_8_ = 0x42b0c0a542b0c0a5;
          auVar107._12_4_ = 0x42b0c0a5;
          auVar107._16_4_ = 0x42b0c0a5;
          auVar107._20_4_ = 0x42b0c0a5;
          auVar107._24_4_ = 0x42b0c0a5;
          auVar107._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar68,auVar107);
          auVar108._8_4_ = 0xc2b0c0a5;
          auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar108._12_4_ = 0xc2b0c0a5;
          auVar108._16_4_ = 0xc2b0c0a5;
          auVar108._20_4_ = 0xc2b0c0a5;
          auVar108._24_4_ = 0xc2b0c0a5;
          auVar108._28_4_ = 0xc2b0c0a5;
          auVar63 = vmaxps_avx(auVar66,auVar108);
          auVar109._8_4_ = 0x3fb8aa3b;
          auVar109._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar109._12_4_ = 0x3fb8aa3b;
          auVar109._16_4_ = 0x3fb8aa3b;
          auVar109._20_4_ = 0x3fb8aa3b;
          auVar109._24_4_ = 0x3fb8aa3b;
          auVar109._28_4_ = 0x3fb8aa3b;
          auVar217._8_4_ = 0x3f000000;
          auVar217._0_8_ = 0x3f0000003f000000;
          auVar217._12_4_ = 0x3f000000;
          auVar217._16_4_ = 0x3f000000;
          auVar217._20_4_ = 0x3f000000;
          auVar217._24_4_ = 0x3f000000;
          auVar217._28_4_ = 0x3f000000;
          auVar74 = vfmadd213ps_fma(auVar109,auVar63,auVar217);
          auVar111 = vroundps_avx(ZEXT1632(auVar74),1);
          auVar66 = vcmpps_avx(ZEXT1632(auVar74),auVar111,1);
          auVar247._8_4_ = 0x3f800000;
          auVar247._0_8_ = 0x3f8000003f800000;
          auVar247._12_4_ = 0x3f800000;
          auVar247._16_4_ = 0x3f800000;
          auVar247._20_4_ = 0x3f800000;
          auVar247._24_4_ = 0x3f800000;
          auVar247._28_4_ = 0x3f800000;
          auVar66 = vandps_avx(auVar66,auVar247);
          auVar66 = vsubps_avx(auVar111,auVar66);
          auVar163._8_4_ = 0x3f318000;
          auVar163._0_8_ = 0x3f3180003f318000;
          auVar163._12_4_ = 0x3f318000;
          auVar163._16_4_ = 0x3f318000;
          auVar163._20_4_ = 0x3f318000;
          auVar163._24_4_ = 0x3f318000;
          auVar163._28_4_ = 0x3f318000;
          auVar74 = vfmsub231ps_fma(auVar63,auVar66,auVar163);
          auVar164._8_4_ = 0x395e8083;
          auVar164._0_8_ = 0x395e8083395e8083;
          auVar164._12_4_ = 0x395e8083;
          auVar164._16_4_ = 0x395e8083;
          auVar164._20_4_ = 0x395e8083;
          auVar164._24_4_ = 0x395e8083;
          auVar164._28_4_ = 0x395e8083;
          auVar113 = vfmsub231ps_fma(ZEXT1632(auVar74),auVar66,auVar164);
          auVar63 = ZEXT1632(auVar113);
          auVar25._28_4_ = 0x395e8083;
          auVar25._0_28_ =
               ZEXT1628(CONCAT412(auVar113._12_4_ * auVar113._12_4_,
                                  CONCAT48(auVar113._8_4_ * auVar113._8_4_,
                                           CONCAT44(auVar113._4_4_ * auVar113._4_4_,
                                                    auVar113._0_4_ * auVar113._0_4_))));
          auVar197._8_4_ = 0x39506967;
          auVar197._0_8_ = 0x3950696739506967;
          auVar197._12_4_ = 0x39506967;
          auVar197._16_4_ = 0x39506967;
          auVar197._20_4_ = 0x39506967;
          auVar197._24_4_ = 0x39506967;
          auVar197._28_4_ = 0x39506967;
          auVar290._8_4_ = 0x3ab743ce;
          auVar290._0_8_ = 0x3ab743ce3ab743ce;
          auVar290._12_4_ = 0x3ab743ce;
          auVar290._16_4_ = 0x3ab743ce;
          auVar290._20_4_ = 0x3ab743ce;
          auVar290._24_4_ = 0x3ab743ce;
          auVar290._28_4_ = 0x3ab743ce;
          auVar74 = vfmadd213ps_fma(auVar197,auVar63,auVar290);
          auVar291._8_4_ = 0x3c088908;
          auVar291._0_8_ = 0x3c0889083c088908;
          auVar291._12_4_ = 0x3c088908;
          auVar291._16_4_ = 0x3c088908;
          auVar291._20_4_ = 0x3c088908;
          auVar291._24_4_ = 0x3c088908;
          auVar291._28_4_ = 0x3c088908;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar291);
          auVar292._8_4_ = 0x3d2aa9c1;
          auVar292._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar292._12_4_ = 0x3d2aa9c1;
          auVar292._16_4_ = 0x3d2aa9c1;
          auVar292._20_4_ = 0x3d2aa9c1;
          auVar292._24_4_ = 0x3d2aa9c1;
          auVar292._28_4_ = 0x3d2aa9c1;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar292);
          auVar293._8_4_ = 0x3e2aaaaa;
          auVar293._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar293._12_4_ = 0x3e2aaaaa;
          auVar293._16_4_ = 0x3e2aaaaa;
          auVar293._20_4_ = 0x3e2aaaaa;
          auVar293._24_4_ = 0x3e2aaaaa;
          auVar293._28_4_ = 0x3e2aaaaa;
          auVar63 = ZEXT1632(auVar113);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar293);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar217);
          auVar202 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar25,auVar63);
          auVar56._0_4_ = (int)auVar66._0_4_;
          auVar56._4_4_ = (int)auVar66._4_4_;
          auVar56._8_4_ = (int)auVar66._8_4_;
          auVar56._12_4_ = (int)auVar66._12_4_;
          auVar69._16_4_ = (int)auVar66._16_4_;
          auVar69._0_16_ = auVar56;
          auVar69._20_4_ = (int)auVar66._20_4_;
          auVar69._24_4_ = (int)auVar66._24_4_;
          auVar69._28_4_ = (int)auVar66._28_4_;
          auVar113 = vpslld_avx(auVar56,0x17);
          auVar74 = vpslld_avx(auVar69._16_16_,0x17);
          auVar125._8_4_ = 0x3f800000;
          auVar125._0_8_ = 0x3f8000003f800000;
          auVar125._12_4_ = 0x3f800000;
          auVar74 = vpaddd_avx(auVar74,auVar125);
          auVar113 = vpaddd_avx(auVar113,auVar125);
          auVar70._16_16_ = auVar74;
          auVar70._0_16_ = auVar113;
          auVar110._0_4_ = auVar202._0_4_ + 1.0;
          auVar110._4_4_ = auVar202._4_4_ + 1.0;
          auVar110._8_4_ = auVar202._8_4_ + 1.0;
          auVar110._12_4_ = auVar202._12_4_ + 1.0;
          auVar110._16_4_ = 0x3f800000;
          auVar110._20_4_ = 0x3f800000;
          auVar110._24_4_ = 0x3f800000;
          auVar110._28_4_ = 0x3f800000;
          auVar74 = vfmadd213ps_fma(auVar70,auVar110,auVar247);
          auVar66 = vdivps_avx(auVar247,ZEXT1632(auVar74));
          break;
        case 5:
          auVar314._8_4_ = 0x42b0c0a5;
          auVar314._0_8_ = 0x42b0c0a542b0c0a5;
          auVar314._12_4_ = 0x42b0c0a5;
          auVar314._16_4_ = 0x42b0c0a5;
          auVar314._20_4_ = 0x42b0c0a5;
          auVar314._24_4_ = 0x42b0c0a5;
          auVar314._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar314,auVar67);
          auVar328._8_4_ = 0xc2b0c0a5;
          auVar328._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar328._12_4_ = 0xc2b0c0a5;
          auVar328._16_4_ = 0xc2b0c0a5;
          auVar328._20_4_ = 0xc2b0c0a5;
          auVar328._24_4_ = 0xc2b0c0a5;
          auVar328._28_4_ = 0xc2b0c0a5;
          auVar63 = vmaxps_avx(auVar328,auVar66);
          auVar339._8_4_ = 0x3fb8aa3b;
          auVar339._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar339._12_4_ = 0x3fb8aa3b;
          auVar339._16_4_ = 0x3fb8aa3b;
          auVar339._20_4_ = 0x3fb8aa3b;
          auVar339._24_4_ = 0x3fb8aa3b;
          auVar339._28_4_ = 0x3fb8aa3b;
          auVar334._8_4_ = 0x3f000000;
          auVar334._0_8_ = 0x3f0000003f000000;
          auVar334._12_4_ = 0x3f000000;
          auVar334._16_4_ = 0x3f000000;
          auVar334._20_4_ = 0x3f000000;
          auVar334._24_4_ = 0x3f000000;
          auVar334._28_4_ = 0x3f000000;
          auVar74 = vfmadd213ps_fma(auVar339,auVar63,auVar334);
          auVar111 = vroundps_avx(ZEXT1632(auVar74),1);
          auVar66 = vcmpps_avx(ZEXT1632(auVar74),auVar111,1);
          auVar345._8_4_ = 0x3f800000;
          auVar345._0_8_ = 0x3f8000003f800000;
          auVar345._12_4_ = 0x3f800000;
          auVar345._16_4_ = 0x3f800000;
          auVar345._20_4_ = 0x3f800000;
          auVar345._24_4_ = 0x3f800000;
          auVar345._28_4_ = 0x3f800000;
          auVar66 = vandps_avx(auVar345,auVar66);
          auVar66 = vsubps_avx(auVar111,auVar66);
          auVar351._8_4_ = 0x3f318000;
          auVar351._0_8_ = 0x3f3180003f318000;
          auVar351._12_4_ = 0x3f318000;
          auVar351._16_4_ = 0x3f318000;
          auVar351._20_4_ = 0x3f318000;
          auVar351._24_4_ = 0x3f318000;
          auVar351._28_4_ = 0x3f318000;
          auVar74 = vfmsub231ps_fma(auVar63,auVar66,auVar351);
          auVar315._8_4_ = 0xb95e8083;
          auVar315._0_8_ = 0xb95e8083b95e8083;
          auVar315._12_4_ = 0xb95e8083;
          auVar315._16_4_ = 0xb95e8083;
          auVar315._20_4_ = 0xb95e8083;
          auVar315._24_4_ = 0xb95e8083;
          auVar315._28_4_ = 0xb95e8083;
          auVar113 = vfnmsub231ps_fma(ZEXT1632(auVar74),auVar66,auVar315);
          auVar63 = ZEXT1632(auVar113);
          auVar23._28_4_ = auVar111._28_4_;
          auVar23._0_28_ =
               ZEXT1628(CONCAT412(auVar113._12_4_ * auVar113._12_4_,
                                  CONCAT48(auVar113._8_4_ * auVar113._8_4_,
                                           CONCAT44(auVar113._4_4_ * auVar113._4_4_,
                                                    auVar113._0_4_ * auVar113._0_4_))));
          auVar361._8_4_ = 0x39506967;
          auVar361._0_8_ = 0x3950696739506967;
          auVar361._12_4_ = 0x39506967;
          auVar361._16_4_ = 0x39506967;
          auVar361._20_4_ = 0x39506967;
          auVar361._24_4_ = 0x39506967;
          auVar361._28_4_ = 0x39506967;
          auVar356._8_4_ = 0x3ab743ce;
          auVar356._0_8_ = 0x3ab743ce3ab743ce;
          auVar356._12_4_ = 0x3ab743ce;
          auVar356._16_4_ = 0x3ab743ce;
          auVar356._20_4_ = 0x3ab743ce;
          auVar356._24_4_ = 0x3ab743ce;
          auVar356._28_4_ = 0x3ab743ce;
          auVar74 = vfmadd213ps_fma(auVar361,auVar63,auVar356);
          auVar239._8_4_ = 0x3c088908;
          auVar239._0_8_ = 0x3c0889083c088908;
          auVar239._12_4_ = 0x3c088908;
          auVar239._16_4_ = 0x3c088908;
          auVar239._20_4_ = 0x3c088908;
          auVar239._24_4_ = 0x3c088908;
          auVar239._28_4_ = 0x3c088908;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar239);
          auVar240._8_4_ = 0x3d2aa9c1;
          auVar240._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar240._12_4_ = 0x3d2aa9c1;
          auVar240._16_4_ = 0x3d2aa9c1;
          auVar240._20_4_ = 0x3d2aa9c1;
          auVar240._24_4_ = 0x3d2aa9c1;
          auVar240._28_4_ = 0x3d2aa9c1;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar240);
          auVar241._8_4_ = 0x3e2aaaaa;
          auVar241._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar241._12_4_ = 0x3e2aaaaa;
          auVar241._16_4_ = 0x3e2aaaaa;
          auVar241._20_4_ = 0x3e2aaaaa;
          auVar241._24_4_ = 0x3e2aaaaa;
          auVar241._28_4_ = 0x3e2aaaaa;
          auVar63 = ZEXT1632(auVar113);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar241);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar334);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar23,auVar63);
          auVar194._0_4_ = auVar74._0_4_ + 1.0;
          auVar194._4_4_ = auVar74._4_4_ + 1.0;
          auVar194._8_4_ = auVar74._8_4_ + 1.0;
          auVar194._12_4_ = auVar74._12_4_ + 1.0;
          auVar194._16_4_ = 0x3f800000;
          auVar194._20_4_ = 0x3f800000;
          auVar194._24_4_ = 0x3f800000;
          auVar194._28_4_ = 0x3f800000;
          auVar74._0_4_ = (int)auVar66._0_4_;
          auVar74._4_4_ = (int)auVar66._4_4_;
          auVar74._8_4_ = (int)auVar66._8_4_;
          auVar74._12_4_ = (int)auVar66._12_4_;
          auVar102._16_4_ = (int)auVar66._16_4_;
          auVar102._0_16_ = auVar74;
          auVar102._20_4_ = (int)auVar66._20_4_;
          auVar102._24_4_ = (int)auVar66._24_4_;
          auVar102._28_4_ = (int)auVar66._28_4_;
          auVar113 = vpslld_avx(auVar74,0x17);
          auVar74 = vpslld_avx(auVar102._16_16_,0x17);
          auVar112._8_4_ = 0x3f800000;
          auVar112._0_8_ = 0x3f8000003f800000;
          auVar112._12_4_ = 0x3f800000;
          auVar74 = vpaddd_avx(auVar74,auVar112);
          auVar113 = vpaddd_avx(auVar113,auVar112);
          auVar103._16_16_ = auVar74;
          auVar103._0_16_ = auVar113;
          auVar202 = vfmadd213ps_fma(auVar103,auVar194,auVar345);
          auVar156._8_4_ = 0x800000;
          auVar156._0_8_ = 0x80000000800000;
          auVar156._12_4_ = 0x800000;
          auVar156._16_4_ = 0x800000;
          auVar156._20_4_ = 0x800000;
          auVar156._24_4_ = 0x800000;
          auVar156._28_4_ = 0x800000;
          auVar66 = vmaxps_avx(ZEXT1632(auVar202),auVar156);
          auVar113 = vpsrld_avx(auVar66._0_16_,0x17);
          auVar74 = vpsrld_avx(auVar66._16_16_,0x17);
          auVar242._8_4_ = 0x807fffff;
          auVar242._0_8_ = 0x807fffff807fffff;
          auVar242._12_4_ = 0x807fffff;
          auVar242._16_4_ = 0x807fffff;
          auVar242._20_4_ = 0x807fffff;
          auVar242._24_4_ = 0x807fffff;
          auVar242._28_4_ = 0x807fffff;
          auVar66 = vandps_avx(auVar66,auVar242);
          auVar111 = vorps_avx(auVar334,auVar66);
          auVar243._8_4_ = 0x3f3504f3;
          auVar243._0_8_ = 0x3f3504f33f3504f3;
          auVar243._12_4_ = 0x3f3504f3;
          auVar243._16_4_ = 0x3f3504f3;
          auVar243._20_4_ = 0x3f3504f3;
          auVar243._24_4_ = 0x3f3504f3;
          auVar243._28_4_ = 0x3f3504f3;
          auVar63 = vcmpps_avx(auVar243,auVar111,2);
          auVar66 = vandnps_avx(auVar63,auVar111);
          auVar329._8_4_ = 0xbf800000;
          auVar329._0_8_ = 0xbf800000bf800000;
          auVar329._12_4_ = 0xbf800000;
          auVar329._16_4_ = 0xbf800000;
          auVar329._20_4_ = 0xbf800000;
          auVar329._24_4_ = 0xbf800000;
          auVar329._28_4_ = 0xbf800000;
          auVar157._0_4_ = auVar111._0_4_ + -1.0 + auVar66._0_4_;
          auVar157._4_4_ = auVar111._4_4_ + -1.0 + auVar66._4_4_;
          auVar157._8_4_ = auVar111._8_4_ + -1.0 + auVar66._8_4_;
          auVar157._12_4_ = auVar111._12_4_ + -1.0 + auVar66._12_4_;
          auVar157._16_4_ = auVar111._16_4_ + -1.0 + auVar66._16_4_;
          auVar157._20_4_ = auVar111._20_4_ + -1.0 + auVar66._20_4_;
          auVar157._24_4_ = auVar111._24_4_ + -1.0 + auVar66._24_4_;
          auVar157._28_4_ = auVar111._28_4_ + -1.0 + auVar66._28_4_;
          auVar74 = vpsubd_avx(auVar74,auVar63._16_16_);
          auVar76._8_4_ = 0xffffff81;
          auVar76._0_8_ = 0xffffff81ffffff81;
          auVar76._12_4_ = 0xffffff81;
          auVar74 = vpaddd_avx(auVar74,auVar76);
          auVar113 = vpsubd_avx(auVar113,auVar63._0_16_);
          auVar113 = vpaddd_avx(auVar113,auVar76);
          auVar195._16_16_ = auVar74;
          auVar195._0_16_ = auVar113;
          auVar216._0_4_ = auVar157._0_4_ * auVar157._0_4_;
          auVar216._4_4_ = auVar157._4_4_ * auVar157._4_4_;
          auVar216._8_4_ = auVar157._8_4_ * auVar157._8_4_;
          auVar216._12_4_ = auVar157._12_4_ * auVar157._12_4_;
          auVar216._16_4_ = auVar157._16_4_ * auVar157._16_4_;
          auVar216._20_4_ = auVar157._20_4_ * auVar157._20_4_;
          auVar216._24_4_ = auVar157._24_4_ * auVar157._24_4_;
          auVar216._28_4_ = 0;
          auVar244._8_4_ = 0x3d9021bb;
          auVar244._0_8_ = 0x3d9021bb3d9021bb;
          auVar244._12_4_ = 0x3d9021bb;
          auVar244._16_4_ = 0x3d9021bb;
          auVar244._20_4_ = 0x3d9021bb;
          auVar244._24_4_ = 0x3d9021bb;
          auVar244._28_4_ = 0x3d9021bb;
          auVar279._8_4_ = 0xbdebd1b8;
          auVar279._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar279._12_4_ = 0xbdebd1b8;
          auVar279._16_4_ = 0xbdebd1b8;
          auVar279._20_4_ = 0xbdebd1b8;
          auVar279._24_4_ = 0xbdebd1b8;
          auVar279._28_4_ = 0xbdebd1b8;
          auVar74 = vfmadd213ps_fma(auVar244,auVar157,auVar279);
          auVar280._8_4_ = 0x3def251a;
          auVar280._0_8_ = 0x3def251a3def251a;
          auVar280._12_4_ = 0x3def251a;
          auVar280._16_4_ = 0x3def251a;
          auVar280._20_4_ = 0x3def251a;
          auVar280._24_4_ = 0x3def251a;
          auVar280._28_4_ = 0x3def251a;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar157,auVar280);
          auVar281._8_4_ = 0xbdfe5d4f;
          auVar281._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar281._12_4_ = 0xbdfe5d4f;
          auVar281._16_4_ = 0xbdfe5d4f;
          auVar281._20_4_ = 0xbdfe5d4f;
          auVar281._24_4_ = 0xbdfe5d4f;
          auVar281._28_4_ = 0xbdfe5d4f;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar157,auVar281);
          auVar282._8_4_ = 0x3e11e9bf;
          auVar282._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar282._12_4_ = 0x3e11e9bf;
          auVar282._16_4_ = 0x3e11e9bf;
          auVar282._20_4_ = 0x3e11e9bf;
          auVar282._24_4_ = 0x3e11e9bf;
          auVar282._28_4_ = 0x3e11e9bf;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar157,auVar282);
          auVar283._8_4_ = 0xbe2aae50;
          auVar283._0_8_ = 0xbe2aae50be2aae50;
          auVar283._12_4_ = 0xbe2aae50;
          auVar283._16_4_ = 0xbe2aae50;
          auVar283._20_4_ = 0xbe2aae50;
          auVar283._24_4_ = 0xbe2aae50;
          auVar283._28_4_ = 0xbe2aae50;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar157,auVar283);
          auVar284._8_4_ = 0x3e4cceac;
          auVar284._0_8_ = 0x3e4cceac3e4cceac;
          auVar284._12_4_ = 0x3e4cceac;
          auVar284._16_4_ = 0x3e4cceac;
          auVar284._20_4_ = 0x3e4cceac;
          auVar284._24_4_ = 0x3e4cceac;
          auVar284._28_4_ = 0x3e4cceac;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar157,auVar284);
          auVar285._8_4_ = 0xbe7ffffc;
          auVar285._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar285._12_4_ = 0xbe7ffffc;
          auVar285._16_4_ = 0xbe7ffffc;
          auVar285._20_4_ = 0xbe7ffffc;
          auVar285._24_4_ = 0xbe7ffffc;
          auVar285._28_4_ = 0xbe7ffffc;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar157,auVar285);
          auVar286._8_4_ = 0x3eaaaaaa;
          auVar286._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar286._12_4_ = 0x3eaaaaaa;
          auVar286._16_4_ = 0x3eaaaaaa;
          auVar286._20_4_ = 0x3eaaaaaa;
          auVar286._24_4_ = 0x3eaaaaaa;
          auVar286._28_4_ = 0x3eaaaaaa;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar157,auVar286);
          auVar245._0_4_ = auVar216._0_4_ * auVar157._0_4_ * auVar74._0_4_;
          auVar245._4_4_ = auVar216._4_4_ * auVar157._4_4_ * auVar74._4_4_;
          auVar245._8_4_ = auVar216._8_4_ * auVar157._8_4_ * auVar74._8_4_;
          auVar245._12_4_ = auVar216._12_4_ * auVar157._12_4_ * auVar74._12_4_;
          auVar245._16_4_ = auVar216._16_4_ * auVar157._16_4_ * 0.0;
          auVar245._20_4_ = auVar216._20_4_ * auVar157._20_4_ * 0.0;
          auVar245._24_4_ = auVar216._24_4_ * auVar157._24_4_ * 0.0;
          auVar245._28_4_ = 0;
          auVar63 = vcvtdq2ps_avx(auVar195);
          auVar74 = vfmadd231ps_fma(auVar245,auVar63,auVar315);
          auVar74 = vfmsub231ps_fma(ZEXT1632(auVar74),auVar334,auVar216);
          auVar66 = vcmpps_avx(ZEXT1632(auVar202),_DAT_0053aa40,2);
          auVar111 = vsubps_avx(ZEXT1632(auVar74),auVar157);
          auVar74 = vfmsub231ps_fma(auVar111,auVar351,auVar63);
          auVar246._8_4_ = 0xc0000000;
          auVar246._0_8_ = 0xc0000000c0000000;
          auVar246._12_4_ = 0xc0000000;
          auVar246._16_4_ = 0xc0000000;
          auVar246._20_4_ = 0xc0000000;
          auVar246._24_4_ = 0xc0000000;
          auVar246._28_4_ = 0xc0000000;
          auVar158._0_4_ = auVar74._0_4_ * -2.0;
          auVar158._4_4_ = auVar74._4_4_ * -2.0;
          auVar158._8_4_ = auVar74._8_4_ * -2.0;
          auVar158._12_4_ = auVar74._12_4_ * -2.0;
          auVar158._16_4_ = 0x80000000;
          auVar158._20_4_ = 0x80000000;
          auVar158._24_4_ = 0x80000000;
          auVar158._28_4_ = 0;
          auVar196._8_4_ = 0x7fffffff;
          auVar196._0_8_ = 0x7fffffff7fffffff;
          auVar196._12_4_ = 0x7fffffff;
          auVar196._16_4_ = 0x7fffffff;
          auVar196._20_4_ = 0x7fffffff;
          auVar196._24_4_ = 0x7fffffff;
          auVar196._28_4_ = 0x7fffffff;
          auVar66 = vblendvps_avx(auVar158,auVar196,auVar66);
          auVar159._8_4_ = 0x42b0c0a5;
          auVar159._0_8_ = 0x42b0c0a542b0c0a5;
          auVar159._12_4_ = 0x42b0c0a5;
          auVar159._16_4_ = 0x42b0c0a5;
          auVar159._20_4_ = 0x42b0c0a5;
          auVar159._24_4_ = 0x42b0c0a5;
          auVar159._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar66,auVar159);
          auVar160._8_4_ = 0xc2b0c0a5;
          auVar160._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar160._12_4_ = 0xc2b0c0a5;
          auVar160._16_4_ = 0xc2b0c0a5;
          auVar160._20_4_ = 0xc2b0c0a5;
          auVar160._24_4_ = 0xc2b0c0a5;
          auVar160._28_4_ = 0xc2b0c0a5;
          auVar63 = vmaxps_avx(auVar66,auVar160);
          auVar74 = vfmadd213ps_fma(auVar339,auVar63,auVar334);
          auVar111 = vroundps_avx(ZEXT1632(auVar74),1);
          auVar66 = vcmpps_avx(ZEXT1632(auVar74),auVar111,1);
          auVar66 = vandps_avx(auVar345,auVar66);
          auVar66 = vsubps_avx(auVar111,auVar66);
          auVar74 = vfmsub231ps_fma(auVar63,auVar66,auVar351);
          auVar113 = vfnmsub231ps_fma(ZEXT1632(auVar74),auVar66,auVar315);
          auVar63 = ZEXT1632(auVar113);
          auVar24._28_4_ = auVar111._28_4_;
          auVar24._0_28_ =
               ZEXT1628(CONCAT412(auVar113._12_4_ * auVar113._12_4_,
                                  CONCAT48(auVar113._8_4_ * auVar113._8_4_,
                                           CONCAT44(auVar113._4_4_ * auVar113._4_4_,
                                                    auVar113._0_4_ * auVar113._0_4_))));
          auVar74 = vfmadd213ps_fma(auVar361,auVar63,auVar356);
          auVar287._8_4_ = 0x3c088908;
          auVar287._0_8_ = 0x3c0889083c088908;
          auVar287._12_4_ = 0x3c088908;
          auVar287._16_4_ = 0x3c088908;
          auVar287._20_4_ = 0x3c088908;
          auVar287._24_4_ = 0x3c088908;
          auVar287._28_4_ = 0x3c088908;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar287);
          auVar288._8_4_ = 0x3d2aa9c1;
          auVar288._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar288._12_4_ = 0x3d2aa9c1;
          auVar288._16_4_ = 0x3d2aa9c1;
          auVar288._20_4_ = 0x3d2aa9c1;
          auVar288._24_4_ = 0x3d2aa9c1;
          auVar288._28_4_ = 0x3d2aa9c1;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar288);
          auVar289._8_4_ = 0x3e2aaaaa;
          auVar289._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar289._12_4_ = 0x3e2aaaaa;
          auVar289._16_4_ = 0x3e2aaaaa;
          auVar289._20_4_ = 0x3e2aaaaa;
          auVar289._24_4_ = 0x3e2aaaaa;
          auVar289._28_4_ = 0x3e2aaaaa;
          auVar63 = ZEXT1632(auVar113);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar289);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar334);
          auVar202 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar24,auVar63);
          auVar80._0_4_ = (int)auVar66._0_4_;
          auVar80._4_4_ = (int)auVar66._4_4_;
          auVar80._8_4_ = (int)auVar66._8_4_;
          auVar80._12_4_ = (int)auVar66._12_4_;
          auVar104._16_4_ = (int)auVar66._16_4_;
          auVar104._0_16_ = auVar80;
          auVar104._20_4_ = (int)auVar66._20_4_;
          auVar104._24_4_ = (int)auVar66._24_4_;
          auVar104._28_4_ = (int)auVar66._28_4_;
          auVar113 = vpslld_avx(auVar80,0x17);
          auVar74 = vpslld_avx(auVar104._16_16_,0x17);
          auVar74 = vpaddd_avx(auVar74,auVar112);
          auVar113 = vpaddd_avx(auVar113,auVar112);
          auVar105._16_16_ = auVar74;
          auVar105._0_16_ = auVar113;
          auVar161._0_4_ = auVar202._0_4_ + 1.0;
          auVar161._4_4_ = auVar202._4_4_ + 1.0;
          auVar161._8_4_ = auVar202._8_4_ + 1.0;
          auVar161._12_4_ = auVar202._12_4_ + 1.0;
          auVar161._16_4_ = 0x3f800000;
          auVar161._20_4_ = 0x3f800000;
          auVar161._24_4_ = 0x3f800000;
          auVar161._28_4_ = 0x3f800000;
          auVar74 = vfmadd213ps_fma(auVar105,auVar161,auVar345);
          auVar66 = vdivps_avx(auVar345,ZEXT1632(auVar74));
          auVar74 = vfnmadd213ps_fma(auVar66,auVar246,auVar329);
          auVar71 = ZEXT1664(auVar74);
          goto LAB_002c395e;
        case 6:
          puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar3 = *puVar15;
          auVar111._4_4_ = uVar3;
          auVar111._0_4_ = uVar3;
          auVar111._8_4_ = uVar3;
          auVar111._12_4_ = uVar3;
          auVar111._16_4_ = uVar3;
          auVar111._20_4_ = uVar3;
          auVar111._24_4_ = uVar3;
          auVar111._28_4_ = uVar3;
          uVar3 = puVar15[1];
          auVar165._4_4_ = uVar3;
          auVar165._0_4_ = uVar3;
          auVar165._8_4_ = uVar3;
          auVar165._12_4_ = uVar3;
          auVar165._16_4_ = uVar3;
          auVar165._20_4_ = uVar3;
          auVar165._24_4_ = uVar3;
          auVar165._28_4_ = uVar3;
          auVar74 = vfmadd231ps_fma(auVar165,auVar67,auVar111);
          auVar66 = vmaxps_avx(ZEXT1632(auVar74),ZEXT832(0) << 0x20);
          auVar166._8_4_ = 0x3f800000;
          auVar166._0_8_ = 0x3f8000003f800000;
          auVar166._12_4_ = 0x3f800000;
          auVar166._16_4_ = 0x3f800000;
          auVar166._20_4_ = 0x3f800000;
          auVar166._24_4_ = 0x3f800000;
          auVar166._28_4_ = 0x3f800000;
          auVar66 = vminps_avx(auVar66,auVar166);
          auVar71 = ZEXT3264(auVar66);
LAB_002c395e:
          auVar294._0_4_ = auVar71._0_4_ * fVar51;
          auVar294._4_4_ = auVar71._4_4_ * fVar72;
          auVar294._8_4_ = auVar71._8_4_ * auVar67._8_4_;
          auVar294._12_4_ = auVar71._12_4_ * auVar67._12_4_;
          auVar294._16_4_ = auVar71._16_4_ * auVar67._16_4_;
          auVar294._20_4_ = auVar71._20_4_ * auVar67._20_4_;
          auVar294._28_36_ = auVar71._28_36_;
          auVar294._24_4_ = auVar71._24_4_ * auVar67._24_4_;
          auVar66 = auVar294._0_32_;
        }
        auVar67 = auVar66;
LAB_002c3967:
        *(undefined1 (*) [32])((long)top_blob->data + local_308 * 4) = auVar67;
        local_360 = local_360 + 8;
        lVar38 = local_2d0 + 8;
        lVar43 = local_2d8 + 8;
        lVar41 = local_2e0 + 8;
        lVar44 = local_2e8 + 8;
        lVar46 = local_2f0 + 8;
        lVar49 = local_2f8 + 8;
        lVar37 = local_300 + 8;
      }
      uVar33 = (long)(int)uVar12 & 0xfffffffffffffff8;
      uVar29 = uVar12 >> 2 & 1;
      local_298 = uVar33 + 1;
      local_2a8._0_8_ = uVar33 + 2;
      local_138._0_8_ = uVar33 + 3;
      local_198._0_8_ = uVar33;
      local_158._0_8_ = uVar33;
      uVar33 = 0;
      while (pauVar35 = local_358, uVar33 != uVar29) {
        uVar32 = local_198._0_8_ + uVar33 * 4;
        local_178._0_8_ = uVar33;
        if (pvVar14 == (void *)0x0) {
          auVar74 = ZEXT816(0) << 0x40;
        }
        else {
          auVar74 = *(undefined1 (*) [16])((long)pvVar14 + uVar32 * 4);
        }
        pvVar16 = (this->weight_data_tm).data;
        sVar17 = (this->weight_data_tm).elemsize;
        lVar43 = (long)(this->weight_data_tm).w;
        lVar38 = sVar17 * lVar43;
        local_2c8._0_8_ = uVar32;
        pauVar47 = (undefined1 (*) [16])(lVar38 * uVar32 + (long)pvVar16);
        pauVar39 = (undefined1 (*) [16])((uVar32 | 1) * lVar38 + (long)pvVar16);
        pauVar42 = (undefined1 (*) [16])((uVar32 | 2) * lVar38 + (long)pvVar16);
        pauVar45 = (undefined1 (*) [16])(lVar38 * (uVar32 | 3) + (long)pvVar16);
        lVar41 = 0;
        auVar113 = ZEXT816(0) << 0x40;
        lVar38 = 0;
        auVar202 = ZEXT816(0) << 0x40;
        auVar80 = ZEXT816(0) << 0x40;
        auVar76 = ZEXT816(0) << 0x40;
        iVar48 = 0;
        pauVar34 = local_358;
        while( true ) {
          auVar352 = ZEXT1664(auVar76);
          auVar346 = ZEXT1664(auVar80);
          auVar294 = ZEXT1664(auVar202);
          auVar71 = ZEXT1664(auVar113);
          local_b8 = ZEXT1632(auVar113);
          local_d8 = ZEXT1632(auVar202);
          local_f8 = ZEXT1632(auVar80);
          local_118 = ZEXT1632(auVar76);
          if (iVar28 <= iVar48 + 7) break;
          auVar66 = *pauVar34;
          auVar113 = vlddqu_avx(*pauVar47);
          auVar63 = vcvtph2ps_f16c(auVar113);
          auVar113 = vlddqu_avx(*pauVar39);
          auVar111 = vcvtph2ps_f16c(auVar113);
          auVar113 = vlddqu_avx(*pauVar42);
          auVar67 = vcvtph2ps_f16c(auVar113);
          auVar113 = vlddqu_avx(*pauVar45);
          auVar165 = vcvtph2ps_f16c(auVar113);
          auVar113 = vfmadd231ps_fma(local_b8,auVar66,auVar63);
          auVar202 = vfmadd231ps_fma(local_d8,auVar66,auVar111);
          auVar80 = vfmadd231ps_fma(local_f8,auVar66,auVar67);
          auVar76 = vfmadd231ps_fma(local_118,auVar66,auVar165);
          pauVar34 = pauVar34 + 1;
          pauVar47 = pauVar47 + 1;
          pauVar39 = pauVar39 + 1;
          pauVar42 = pauVar42 + 1;
          pauVar45 = pauVar45 + 1;
          iVar48 = iVar48 + 8;
          lVar38 = lVar38 + 0x10;
          lVar41 = lVar41 + 8;
        }
        lVar49 = sVar17 * local_158._0_8_ * lVar43;
        lVar44 = sVar17 * local_298 * lVar43;
        lVar46 = sVar17 * local_2a8._0_8_ * lVar43;
        lVar43 = sVar17 * local_138._0_8_ * lVar43;
        local_238 = ZEXT816(0) << 0x40;
        local_248 = ZEXT816(0) << 0x40;
        local_258 = ZEXT816(0) << 0x40;
        local_268 = ZEXT816(0) << 0x40;
        for (; iVar48 + 3 < iVar28; iVar48 = iVar48 + 4) {
          auVar202._8_8_ = 0;
          auVar202._0_8_ = *(ulong *)((long)pvVar16 + lVar38 + lVar49);
          auVar202 = vcvtph2ps_f16c(auVar202);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)pvVar16 + lVar38 + lVar44);
          auVar80 = vcvtph2ps_f16c(auVar8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)((long)pvVar16 + lVar38 + lVar46);
          auVar76 = vcvtph2ps_f16c(auVar9);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)pvVar16 + lVar38 + lVar43);
          auVar112 = vcvtph2ps_f16c(auVar10);
          auVar113 = *(undefined1 (*) [16])(*local_358 + lVar38 * 2);
          local_238 = vfmadd231ps_fma(local_238,auVar113,auVar202);
          local_248 = vfmadd231ps_fma(local_248,auVar113,auVar80);
          local_258 = vfmadd231ps_fma(local_258,auVar113,auVar76);
          local_268 = vfmadd231ps_fma(local_268,auVar113,auVar112);
          lVar38 = lVar38 + 8;
          lVar41 = lVar41 + 4;
        }
        for (; (int)lVar41 < iVar28; lVar41 = lVar41 + 1) {
          local_288._0_16_ = auVar74;
          local_1c8._0_16_ = ZEXT416(*(uint *)(*pauVar35 + lVar41 * 4));
          fVar51 = float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar41 * 2 + lVar49));
          auVar66 = local_1e8;
          local_1e8._4_4_ = extraout_XMM0_Db_05;
          local_1e8._0_4_ = fVar51;
          local_1e8._8_4_ = extraout_XMM0_Dc_04;
          local_1e8._16_16_ = auVar66._16_16_;
          local_1e8._12_4_ = extraout_XMM0_Dd_04;
          uVar4 = *(uint *)(*pauVar35 + lVar41 * 4);
          local_1f8 = float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar41 * 2 + lVar44));
          local_208 = ZEXT416(*(uint *)(*pauVar35 + lVar41 * 4));
          local_218 = float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar41 * 2 + lVar46));
          local_228 = ZEXT416(*(uint *)(*pauVar35 + lVar41 * 4));
          auVar346._0_4_ =
               float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar41 * 2 + lVar43));
          auVar346._4_60_ = extraout_var_00;
          auVar74 = vinsertps_avx(local_1e8._0_16_,ZEXT416((uint)local_1f8),0x10);
          auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)local_218),0x20);
          auVar74 = vinsertps_avx(auVar74,auVar346._0_16_,0x30);
          auVar113 = vinsertps_avx(local_1c8._0_16_,ZEXT416(uVar4),0x10);
          auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)local_208._0_4_),0x20);
          auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)local_228._0_4_),0x30);
          auVar74 = vfmadd231ps_fma(local_288._0_16_,auVar74,auVar113);
          auVar71 = ZEXT3264(local_b8);
          auVar294 = ZEXT3264(local_d8);
          auVar346 = ZEXT3264(local_f8);
          auVar352 = ZEXT3264(local_118);
        }
        auVar66 = vhaddps_avx(auVar71._0_32_,auVar294._0_32_);
        auVar63 = vhaddps_avx(auVar346._0_32_,auVar352._0_32_);
        auVar66 = vhaddps_avx(auVar66,auVar63);
        auVar202 = vunpcklps_avx(local_238,local_248);
        auVar80 = vunpcklps_avx(local_258,local_268);
        auVar76 = vunpckhps_avx(local_238,local_248);
        auVar112 = vunpckhps_avx(local_258,local_268);
        auVar113 = vmovlhps_avx(auVar202,auVar80);
        auVar80 = vunpckhpd_avx(auVar202,auVar80);
        auVar202 = vmovlhps_avx(auVar76,auVar112);
        auVar76 = vunpckhpd_avx(auVar76,auVar112);
        auVar57._0_4_ =
             auVar80._0_4_ + auVar113._0_4_ + auVar202._0_4_ + auVar76._0_4_ + auVar74._0_4_ +
             auVar66._0_4_ + auVar66._16_4_;
        auVar57._4_4_ =
             auVar80._4_4_ + auVar113._4_4_ + auVar202._4_4_ + auVar76._4_4_ + auVar74._4_4_ +
             auVar66._4_4_ + auVar66._20_4_;
        auVar57._8_4_ =
             auVar80._8_4_ + auVar113._8_4_ + auVar202._8_4_ + auVar76._8_4_ + auVar74._8_4_ +
             auVar66._8_4_ + auVar66._24_4_;
        auVar57._12_4_ =
             auVar80._12_4_ + auVar113._12_4_ + auVar202._12_4_ + auVar76._12_4_ + auVar74._12_4_ +
             auVar66._12_4_ + auVar66._28_4_;
        auVar90 = auVar57;
        if (iVar31 - 1U < 6) {
          auVar74 = ZEXT816(0) << 0x20;
          auVar90 = vmaxps_avx(auVar57,auVar74);
          switch(iVar31) {
          case 2:
            auVar74 = vminps_avx(auVar57,auVar74);
            uVar3 = *(this->super_InnerProduct).activation_params.data;
            auVar126._4_4_ = uVar3;
            auVar126._0_4_ = uVar3;
            auVar126._8_4_ = uVar3;
            auVar126._12_4_ = uVar3;
            auVar90 = vfmadd231ps_fma(auVar90,auVar74,auVar126);
            break;
          case 3:
            puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar3 = *puVar15;
            auVar84._4_4_ = uVar3;
            auVar84._0_4_ = uVar3;
            auVar84._8_4_ = uVar3;
            auVar84._12_4_ = uVar3;
            uVar3 = puVar15[1];
            auVar132._4_4_ = uVar3;
            auVar132._0_4_ = uVar3;
            auVar132._8_4_ = uVar3;
            auVar132._12_4_ = uVar3;
            auVar74 = vmaxps_avx(auVar57,auVar84);
            auVar90 = vminps_avx(auVar74,auVar132);
            break;
          case 4:
            uVar33 = CONCAT44(auVar57._4_4_,auVar57._0_4_);
            auVar58._0_8_ = uVar33 ^ 0x8000000080000000;
            auVar58._8_4_ = -auVar57._8_4_;
            auVar58._12_4_ = -auVar57._12_4_;
            auVar85._8_4_ = 0x42b0c0a5;
            auVar85._0_8_ = 0x42b0c0a542b0c0a5;
            auVar85._12_4_ = 0x42b0c0a5;
            auVar74 = vminps_avx(auVar58,auVar85);
            auVar86._8_4_ = 0xc2b0c0a5;
            auVar86._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar86._12_4_ = 0xc2b0c0a5;
            auVar202 = vmaxps_avx(auVar74,auVar86);
            auVar87._8_4_ = 0x3fb8aa3b;
            auVar87._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar87._12_4_ = 0x3fb8aa3b;
            auVar228._8_4_ = 0x3f000000;
            auVar228._0_8_ = 0x3f0000003f000000;
            auVar228._12_4_ = 0x3f000000;
            auVar74 = vfmadd213ps_fma(auVar87,auVar202,auVar228);
            auVar133._0_4_ = (int)auVar74._0_4_;
            auVar133._4_4_ = (int)auVar74._4_4_;
            auVar133._8_4_ = (int)auVar74._8_4_;
            auVar133._12_4_ = (int)auVar74._12_4_;
            auVar113 = vcvtdq2ps_avx(auVar133);
            auVar74 = vcmpps_avx(auVar74,auVar113,1);
            auVar211._8_4_ = 0x3f800000;
            auVar211._0_8_ = 0x3f8000003f800000;
            auVar211._12_4_ = 0x3f800000;
            auVar74 = vandps_avx(auVar74,auVar211);
            auVar74 = vsubps_avx(auVar113,auVar74);
            auVar134._8_4_ = 0x3f318000;
            auVar134._0_8_ = 0x3f3180003f318000;
            auVar134._12_4_ = 0x3f318000;
            auVar113 = vfmsub231ps_fma(auVar202,auVar74,auVar134);
            auVar135._8_4_ = 0x395e8083;
            auVar135._0_8_ = 0x395e8083395e8083;
            auVar135._12_4_ = 0x395e8083;
            auVar202 = vfmsub231ps_fma(auVar113,auVar74,auVar135);
            auVar136._0_4_ = auVar202._0_4_ * auVar202._0_4_;
            auVar136._4_4_ = auVar202._4_4_ * auVar202._4_4_;
            auVar136._8_4_ = auVar202._8_4_ * auVar202._8_4_;
            auVar136._12_4_ = auVar202._12_4_ * auVar202._12_4_;
            auVar186._8_4_ = 0x39506967;
            auVar186._0_8_ = 0x3950696739506967;
            auVar186._12_4_ = 0x39506967;
            auVar258._8_4_ = 0x3ab743ce;
            auVar258._0_8_ = 0x3ab743ce3ab743ce;
            auVar258._12_4_ = 0x3ab743ce;
            auVar113 = vfmadd213ps_fma(auVar186,auVar202,auVar258);
            auVar259._8_4_ = 0x3c088908;
            auVar259._0_8_ = 0x3c0889083c088908;
            auVar259._12_4_ = 0x3c088908;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar259);
            auVar260._8_4_ = 0x3d2aa9c1;
            auVar260._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar260._12_4_ = 0x3d2aa9c1;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar260);
            auVar261._8_4_ = 0x3e2aaaaa;
            auVar261._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar261._12_4_ = 0x3e2aaaaa;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar261);
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar228);
            auVar113 = vfmadd213ps_fma(auVar113,auVar136,auVar202);
            auVar59._0_4_ = auVar113._0_4_ + 1.0;
            auVar59._4_4_ = auVar113._4_4_ + 1.0;
            auVar59._8_4_ = auVar113._8_4_ + 1.0;
            auVar59._12_4_ = auVar113._12_4_ + 1.0;
            auVar88._0_4_ = (int)auVar74._0_4_;
            auVar88._4_4_ = (int)auVar74._4_4_;
            auVar88._8_4_ = (int)auVar74._8_4_;
            auVar88._12_4_ = (int)auVar74._12_4_;
            auVar74 = vpslld_avx(auVar88,0x17);
            auVar74 = vpaddd_avx(auVar74,auVar211);
            auVar74 = vfmadd213ps_fma(auVar74,auVar59,auVar211);
            auVar90 = vdivps_avx(auVar211,auVar74);
            break;
          case 5:
            auVar310._8_4_ = 0x42b0c0a5;
            auVar310._0_8_ = 0x42b0c0a542b0c0a5;
            auVar310._12_4_ = 0x42b0c0a5;
            auVar74 = vminps_avx(auVar310,auVar57);
            auVar324._8_4_ = 0xc2b0c0a5;
            auVar324._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar324._12_4_ = 0xc2b0c0a5;
            auVar202 = vmaxps_avx(auVar324,auVar74);
            auVar332._8_4_ = 0x3fb8aa3b;
            auVar332._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar332._12_4_ = 0x3fb8aa3b;
            auVar336._8_4_ = 0x3f000000;
            auVar336._0_8_ = 0x3f0000003f000000;
            auVar336._12_4_ = 0x3f000000;
            auVar74 = vfmadd213ps_fma(auVar332,auVar202,auVar336);
            auVar180._0_4_ = (int)auVar74._0_4_;
            auVar180._4_4_ = (int)auVar74._4_4_;
            auVar180._8_4_ = (int)auVar74._8_4_;
            auVar180._12_4_ = (int)auVar74._12_4_;
            auVar113 = vcvtdq2ps_avx(auVar180);
            auVar74 = vcmpps_avx(auVar74,auVar113,1);
            auVar301._8_4_ = 0x3f800000;
            auVar301._0_8_ = 0x3f8000003f800000;
            auVar301._12_4_ = 0x3f800000;
            auVar74 = vandps_avx(auVar74,auVar301);
            auVar74 = vsubps_avx(auVar113,auVar74);
            auVar341._8_4_ = 0x3f318000;
            auVar341._0_8_ = 0x3f3180003f318000;
            auVar341._12_4_ = 0x3f318000;
            auVar113 = vfmsub231ps_fma(auVar202,auVar74,auVar341);
            auVar311._8_4_ = 0xb95e8083;
            auVar311._0_8_ = 0xb95e8083b95e8083;
            auVar311._12_4_ = 0xb95e8083;
            auVar202 = vfnmsub231ps_fma(auVar113,auVar74,auVar311);
            auVar181._0_4_ = auVar202._0_4_ * auVar202._0_4_;
            auVar181._4_4_ = auVar202._4_4_ * auVar202._4_4_;
            auVar181._8_4_ = auVar202._8_4_ * auVar202._8_4_;
            auVar181._12_4_ = auVar202._12_4_ * auVar202._12_4_;
            auVar354._8_4_ = 0x39506967;
            auVar354._0_8_ = 0x3950696739506967;
            auVar354._12_4_ = 0x39506967;
            auVar348._8_4_ = 0x3ab743ce;
            auVar348._0_8_ = 0x3ab743ce3ab743ce;
            auVar348._12_4_ = 0x3ab743ce;
            auVar113 = vfmadd213ps_fma(auVar354,auVar202,auVar348);
            auVar359._8_4_ = 0x3c088908;
            auVar359._0_8_ = 0x3c0889083c088908;
            auVar359._12_4_ = 0x3c088908;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar359);
            auVar222._8_4_ = 0x3d2aa9c1;
            auVar222._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar222._12_4_ = 0x3d2aa9c1;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar222);
            auVar223._8_4_ = 0x3e2aaaaa;
            auVar223._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar223._12_4_ = 0x3e2aaaaa;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar223);
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar336);
            auVar113 = vfmadd213ps_fma(auVar113,auVar181,auVar202);
            auVar182._0_4_ = auVar113._0_4_ + 1.0;
            auVar182._4_4_ = auVar113._4_4_ + 1.0;
            auVar182._8_4_ = auVar113._8_4_ + 1.0;
            auVar182._12_4_ = auVar113._12_4_ + 1.0;
            auVar81._0_4_ = (int)auVar74._0_4_;
            auVar81._4_4_ = (int)auVar74._4_4_;
            auVar81._8_4_ = (int)auVar74._8_4_;
            auVar81._12_4_ = (int)auVar74._12_4_;
            auVar74 = vpslld_avx(auVar81,0x17);
            auVar74 = vpaddd_avx(auVar74,auVar301);
            auVar76 = vfmadd213ps_fma(auVar74,auVar182,auVar301);
            auVar127._8_4_ = 0x800000;
            auVar127._0_8_ = 0x80000000800000;
            auVar127._12_4_ = 0x800000;
            auVar74 = vmaxps_avx(auVar76,auVar127);
            auVar113 = vpsrld_avx(auVar74,0x17);
            auVar207._8_4_ = 0xffffff82;
            auVar207._0_8_ = 0xffffff82ffffff82;
            auVar207._12_4_ = 0xffffff82;
            auVar113 = vpaddd_avx(auVar113,auVar207);
            auVar208._8_4_ = 0x807fffff;
            auVar208._0_8_ = 0x807fffff807fffff;
            auVar208._12_4_ = 0x807fffff;
            auVar74 = vandps_avx(auVar74,auVar208);
            auVar80 = vorps_avx(auVar336,auVar74);
            auVar202 = vcvtdq2ps_avx(auVar113);
            auVar209._8_4_ = 0x3f3504f3;
            auVar209._0_8_ = 0x3f3504f33f3504f3;
            auVar209._12_4_ = 0x3f3504f3;
            auVar113 = vcmpps_avx(auVar80,auVar209,1);
            auVar74 = vandps_avx(auVar113,auVar80);
            auVar128._0_4_ = auVar80._0_4_ + -1.0 + auVar74._0_4_;
            auVar128._4_4_ = auVar80._4_4_ + -1.0 + auVar74._4_4_;
            auVar128._8_4_ = auVar80._8_4_ + -1.0 + auVar74._8_4_;
            auVar128._12_4_ = auVar80._12_4_ + -1.0 + auVar74._12_4_;
            auVar74 = vandps_avx(auVar113,auVar301);
            auVar113 = vsubps_avx(auVar202,auVar74);
            auVar210._0_4_ = auVar128._0_4_ * auVar128._0_4_;
            auVar210._4_4_ = auVar128._4_4_ * auVar128._4_4_;
            auVar210._8_4_ = auVar128._8_4_ * auVar128._8_4_;
            auVar210._12_4_ = auVar128._12_4_ * auVar128._12_4_;
            auVar224._8_4_ = 0x3d9021bb;
            auVar224._0_8_ = 0x3d9021bb3d9021bb;
            auVar224._12_4_ = 0x3d9021bb;
            auVar250._8_4_ = 0xbdebd1b8;
            auVar250._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar250._12_4_ = 0xbdebd1b8;
            auVar74 = vfmadd213ps_fma(auVar224,auVar128,auVar250);
            auVar251._8_4_ = 0x3def251a;
            auVar251._0_8_ = 0x3def251a3def251a;
            auVar251._12_4_ = 0x3def251a;
            auVar74 = vfmadd213ps_fma(auVar74,auVar128,auVar251);
            auVar252._8_4_ = 0xbdfe5d4f;
            auVar252._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar252._12_4_ = 0xbdfe5d4f;
            auVar74 = vfmadd213ps_fma(auVar74,auVar128,auVar252);
            auVar253._8_4_ = 0x3e11e9bf;
            auVar253._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar253._12_4_ = 0x3e11e9bf;
            auVar74 = vfmadd213ps_fma(auVar74,auVar128,auVar253);
            auVar254._8_4_ = 0xbe2aae50;
            auVar254._0_8_ = 0xbe2aae50be2aae50;
            auVar254._12_4_ = 0xbe2aae50;
            auVar74 = vfmadd213ps_fma(auVar74,auVar128,auVar254);
            auVar255._8_4_ = 0x3e4cceac;
            auVar255._0_8_ = 0x3e4cceac3e4cceac;
            auVar255._12_4_ = 0x3e4cceac;
            auVar74 = vfmadd213ps_fma(auVar74,auVar128,auVar255);
            auVar256._8_4_ = 0xbe7ffffc;
            auVar256._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar256._12_4_ = 0xbe7ffffc;
            auVar74 = vfmadd213ps_fma(auVar74,auVar128,auVar256);
            auVar257._8_4_ = 0x3eaaaaaa;
            auVar257._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar257._12_4_ = 0x3eaaaaaa;
            auVar74 = vfmadd213ps_fma(auVar74,auVar128,auVar257);
            auVar225._0_4_ = auVar210._0_4_ * auVar128._0_4_ * auVar74._0_4_;
            auVar225._4_4_ = auVar210._4_4_ * auVar128._4_4_ * auVar74._4_4_;
            auVar225._8_4_ = auVar210._8_4_ * auVar128._8_4_ * auVar74._8_4_;
            auVar225._12_4_ = auVar210._12_4_ * auVar128._12_4_ * auVar74._12_4_;
            auVar26._12_4_ = 0;
            auVar26._0_12_ = ZEXT412(0);
            auVar74 = vfmadd231ps_fma(auVar225,auVar113,auVar311);
            auVar202 = vfmsub231ps_fma(auVar74,auVar336,auVar210);
            auVar74 = vcmpps_avx(auVar76,auVar26 << 0x20,2);
            auVar202 = vsubps_avx(auVar202,auVar128);
            auVar113 = vfnmadd231ps_fma(auVar202,auVar341,auVar113);
            auVar129._0_4_ = auVar113._0_4_ + auVar113._0_4_;
            auVar129._4_4_ = auVar113._4_4_ + auVar113._4_4_;
            auVar129._8_4_ = auVar113._8_4_ + auVar113._8_4_;
            auVar129._12_4_ = auVar113._12_4_ + auVar113._12_4_;
            auVar183._8_4_ = 0x7fffffff;
            auVar183._0_8_ = 0x7fffffff7fffffff;
            auVar183._12_4_ = 0x7fffffff;
            auVar74 = vblendvps_avx(auVar129,auVar183,auVar74);
            auVar130._8_4_ = 0x42b0c0a5;
            auVar130._0_8_ = 0x42b0c0a542b0c0a5;
            auVar130._12_4_ = 0x42b0c0a5;
            auVar74 = vminps_avx(auVar74,auVar130);
            auVar202 = vmaxps_avx(auVar324,auVar74);
            auVar74 = vfmadd213ps_fma(auVar332,auVar202,auVar336);
            auVar184._0_4_ = (int)auVar74._0_4_;
            auVar184._4_4_ = (int)auVar74._4_4_;
            auVar184._8_4_ = (int)auVar74._8_4_;
            auVar184._12_4_ = (int)auVar74._12_4_;
            auVar113 = vcvtdq2ps_avx(auVar184);
            auVar74 = vcmpps_avx(auVar74,auVar113,1);
            auVar74 = vandps_avx(auVar74,auVar301);
            auVar74 = vsubps_avx(auVar113,auVar74);
            auVar113 = vfmsub231ps_fma(auVar202,auVar74,auVar341);
            auVar202 = vfnmsub231ps_fma(auVar113,auVar74,auVar311);
            auVar185._0_4_ = auVar202._0_4_ * auVar202._0_4_;
            auVar185._4_4_ = auVar202._4_4_ * auVar202._4_4_;
            auVar185._8_4_ = auVar202._8_4_ * auVar202._8_4_;
            auVar185._12_4_ = auVar202._12_4_ * auVar202._12_4_;
            auVar113 = vfmadd213ps_fma(auVar354,auVar202,auVar348);
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar359);
            auVar226._8_4_ = 0x3d2aa9c1;
            auVar226._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar226._12_4_ = 0x3d2aa9c1;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar226);
            auVar227._8_4_ = 0x3e2aaaaa;
            auVar227._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar227._12_4_ = 0x3e2aaaaa;
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar227);
            auVar113 = vfmadd213ps_fma(auVar113,auVar202,auVar336);
            auVar113 = vfmadd213ps_fma(auVar113,auVar185,auVar202);
            auVar82._0_4_ = auVar113._0_4_ + 1.0;
            auVar82._4_4_ = auVar113._4_4_ + 1.0;
            auVar82._8_4_ = auVar113._8_4_ + 1.0;
            auVar82._12_4_ = auVar113._12_4_ + 1.0;
            auVar131._0_4_ = (int)auVar74._0_4_;
            auVar131._4_4_ = (int)auVar74._4_4_;
            auVar131._8_4_ = (int)auVar74._8_4_;
            auVar131._12_4_ = (int)auVar74._12_4_;
            auVar74 = vpslld_avx(auVar131,0x17);
            auVar74 = vpaddd_avx(auVar74,auVar301);
            auVar74 = vfmadd213ps_fma(auVar74,auVar82,auVar301);
            auVar83._8_4_ = 0x40000000;
            auVar83._0_8_ = 0x4000000040000000;
            auVar83._12_4_ = 0x40000000;
            auVar74 = vdivps_avx(auVar83,auVar74);
            auVar90 = vfmsub213ps_fma(auVar74,auVar57,auVar57);
            break;
          case 6:
            puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar3 = *puVar15;
            auVar89._4_4_ = uVar3;
            auVar89._0_4_ = uVar3;
            auVar89._8_4_ = uVar3;
            auVar89._12_4_ = uVar3;
            uVar3 = puVar15[1];
            auVar137._4_4_ = uVar3;
            auVar137._0_4_ = uVar3;
            auVar137._8_4_ = uVar3;
            auVar137._12_4_ = uVar3;
            auVar113 = vfmadd231ps_fma(auVar137,auVar57,auVar89);
            auVar74 = vmaxps_avx(auVar113,auVar74);
            auVar138._8_4_ = 0x3f800000;
            auVar138._0_8_ = 0x3f8000003f800000;
            auVar138._12_4_ = 0x3f800000;
            auVar74 = vminps_avx(auVar74,auVar138);
            auVar90._0_4_ = auVar74._0_4_ * auVar57._0_4_;
            auVar90._4_4_ = auVar74._4_4_ * auVar57._4_4_;
            auVar90._8_4_ = auVar74._8_4_ * auVar57._8_4_;
            auVar90._12_4_ = auVar74._12_4_ * auVar57._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_2c8._0_8_ * 4) = auVar90;
        local_158._0_8_ = local_158._0_8_ + 4;
        local_298 = local_298 + 4;
        local_2a8._0_8_ = local_2a8._0_8_ + 4;
        local_138._0_8_ = local_138._0_8_ + 4;
        uVar33 = local_178._0_8_ + 1;
      }
      for (lVar38 = (long)(int)(local_198._0_4_ + uVar29 * 4); pauVar35 = local_358,
          lVar38 < (int)uVar12; lVar38 = lVar38 + 1) {
        if (pvVar14 == (void *)0x0) {
          auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar71 = ZEXT464(*(uint *)((long)pvVar14 + lVar38 * 4));
        }
        pvVar16 = (this->weight_data_tm).data;
        sVar17 = (this->weight_data_tm).elemsize;
        lVar43 = (long)(this->weight_data_tm).w;
        pauVar39 = (undefined1 (*) [16])(lVar38 * lVar43 * sVar17 + (long)pvVar16);
        lVar41 = 0;
        auVar74 = ZEXT816(0) << 0x40;
        iVar48 = 0;
        pauVar34 = local_358;
        while( true ) {
          auVar294 = ZEXT1664(auVar74);
          local_1e8 = ZEXT1632(auVar74);
          if (iVar28 <= iVar48 + 7) break;
          auVar74 = vlddqu_avx(*pauVar39);
          auVar66 = vcvtph2ps_f16c(auVar74);
          auVar74 = vfmadd231ps_fma(local_1e8,auVar66,*pauVar34);
          pauVar34 = pauVar34 + 1;
          pauVar39 = pauVar39 + 1;
          iVar48 = iVar48 + 8;
          lVar41 = lVar41 + 8;
        }
        auVar74 = ZEXT816(0) << 0x40;
        for (; iVar48 + 3 < iVar28; iVar48 = iVar48 + 4) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)*pauVar39;
          auVar113 = vcvtph2ps_f16c(auVar11);
          auVar74 = vfmadd231ps_fma(auVar74,auVar113,*(undefined1 (*) [16])*pauVar34);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          pauVar39 = (undefined1 (*) [16])(*pauVar39 + 8);
          lVar41 = lVar41 + 4;
        }
        while( true ) {
          if (iVar28 <= (int)lVar41) break;
          local_288._0_4_ = auVar71._0_4_;
          local_1c8._0_4_ = *(undefined4 *)(*pauVar35 + lVar41 * 4);
          auVar352._0_4_ =
               float16_to_float32(*(unsigned_short *)
                                   ((long)pvVar16 + lVar41 * 2 + sVar17 * lVar38 * lVar43));
          auVar352._4_60_ = extraout_var_01;
          auVar113 = vfmadd231ss_fma(ZEXT416((uint)local_288._0_4_),auVar352._0_16_,
                                     ZEXT416((uint)local_1c8._0_4_));
          auVar71 = ZEXT1664(auVar113);
          lVar41 = lVar41 + 1;
          auVar294 = ZEXT3264(local_1e8);
        }
        auVar60._0_4_ = auVar294._0_4_ + auVar74._0_4_ + auVar294._16_4_;
        auVar60._4_4_ = auVar294._4_4_ + auVar74._4_4_ + auVar294._20_4_;
        auVar60._8_4_ = auVar294._8_4_ + auVar74._8_4_ + auVar294._24_4_;
        auVar60._12_4_ = auVar294._12_4_ + auVar74._12_4_ + auVar294._28_4_;
        auVar74 = vhaddps_avx(auVar60,auVar60);
        auVar74 = vhaddps_avx(auVar74,auVar74);
        fVar51 = auVar74._0_4_ + auVar71._0_4_;
        auVar74 = ZEXT416((uint)fVar51);
        fVar72 = fVar51;
        switch(iVar31) {
        case 1:
          auVar74 = vmaxss_avx(auVar74,ZEXT416(0));
          fVar72 = auVar74._0_4_;
          break;
        case 2:
          auVar74 = vcmpss_avx(ZEXT816(0) << 0x20,auVar74,1);
          auVar140._8_4_ = 0x3f800000;
          auVar140._0_8_ = 0x3f8000003f800000;
          auVar140._12_4_ = 0x3f800000;
          auVar74 = vblendvps_avx(ZEXT416(*(this->super_InnerProduct).activation_params.data),
                                  auVar140,auVar74);
          fVar72 = auVar74._0_4_ * fVar51;
          break;
        case 3:
          puVar18 = (uint *)(this->super_InnerProduct).activation_params.data;
          fVar51 = (float)puVar18[1];
          auVar74 = vmaxss_avx(auVar74,ZEXT416(*puVar18));
          fVar72 = auVar74._0_4_;
          if (fVar51 < auVar74._0_4_) {
            fVar72 = fVar51;
          }
          break;
        case 4:
          auVar74 = vminss_avx(auVar74,ZEXT416(0x42b0c0a5));
          auVar91._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
          auVar91._8_4_ = auVar74._8_4_ ^ 0x80000000;
          auVar91._12_4_ = auVar74._12_4_ ^ 0x80000000;
          auVar74 = vcmpss_avx(auVar74,ZEXT416(0xc2b0c0a5),1);
          auVar139._8_4_ = 0x42b0c0a5;
          auVar139._0_8_ = 0x42b0c0a542b0c0a5;
          auVar139._12_4_ = 0x42b0c0a5;
          auVar74 = vblendvps_avx(auVar91,auVar139,auVar74);
          fVar51 = expf(auVar74._0_4_);
          fVar72 = 1.0 / (fVar51 + 1.0);
          break;
        case 5:
          local_288._0_4_ = fVar51;
          fVar51 = expf(fVar51);
          fVar51 = logf(fVar51 + 1.0);
          fVar51 = tanhf(fVar51);
          fVar72 = fVar51 * (float)local_288._0_4_;
          break;
        case 6:
          pfVar19 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar5 = *pfVar19;
          fVar6 = pfVar19[1];
          fVar167 = -fVar6 / fVar5;
          fVar72 = 0.0;
          if ((fVar167 <= fVar51) && (fVar72 = fVar51, fVar51 <= fVar167 + 1.0 / fVar5)) {
            auVar74 = vfmadd213ss_fma(ZEXT416((uint)fVar5),auVar74,ZEXT416((uint)fVar6));
            fVar72 = auVar74._0_4_ * fVar51;
          }
        }
        *(float *)((long)top_blob->data + lVar38 * 4) = fVar72;
      }
    }
    else if (iVar48 == 4) {
      if ((int)uVar12 < 1) {
        uVar33 = 0;
      }
      auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar294 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
        if (pvVar14 == (void *)0x0) {
          auVar74 = ZEXT816(0) << 0x40;
        }
        else {
          auVar74 = *(undefined1 (*) [16])((long)pvVar14 + uVar32 * 0x10);
        }
        pvVar16 = (this->weight_data_tm).data;
        sVar17 = (this->weight_data_tm).elemsize;
        lVar43 = (long)(this->weight_data_tm).w;
        pauVar34 = (undefined1 (*) [32])(uVar32 * lVar43 * sVar17 + (long)pvVar16);
        lVar38 = 0;
        auVar76 = ZEXT816(0) << 0x40;
        auVar80 = ZEXT816(0) << 0x40;
        auVar202 = ZEXT816(0) << 0x40;
        auVar113 = ZEXT816(0) << 0x40;
        pauVar35 = local_358;
        for (iVar48 = 0; iVar48 + 7 < iVar28; iVar48 = iVar48 + 8) {
          uVar3 = *(undefined4 *)*pauVar35;
          auVar214._4_4_ = uVar3;
          auVar214._0_4_ = uVar3;
          auVar214._8_4_ = uVar3;
          auVar214._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 4);
          auVar214._20_4_ = uVar3;
          auVar214._16_4_ = uVar3;
          auVar214._24_4_ = uVar3;
          auVar214._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 8);
          auVar327._4_4_ = uVar3;
          auVar327._0_4_ = uVar3;
          auVar327._8_4_ = uVar3;
          auVar327._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0xc);
          auVar327._20_4_ = uVar3;
          auVar327._16_4_ = uVar3;
          auVar327._24_4_ = uVar3;
          auVar327._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0x10);
          auVar338._4_4_ = uVar3;
          auVar338._0_4_ = uVar3;
          auVar338._8_4_ = uVar3;
          auVar338._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0x14);
          auVar338._20_4_ = uVar3;
          auVar338._16_4_ = uVar3;
          auVar338._24_4_ = uVar3;
          auVar338._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0x18);
          auVar344._4_4_ = uVar3;
          auVar344._0_4_ = uVar3;
          auVar344._8_4_ = uVar3;
          auVar344._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0x1c);
          auVar344._20_4_ = uVar3;
          auVar344._16_4_ = uVar3;
          auVar344._24_4_ = uVar3;
          auVar344._28_4_ = uVar3;
          auVar66 = vlddqu_avx(*pauVar34);
          auVar63 = vlddqu_avx(pauVar34[1]);
          auVar111 = vcvtph2ps_f16c(auVar66._0_16_);
          auVar66 = vcvtph2ps_f16c(auVar66._16_16_);
          auVar67 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar214,auVar111);
          auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar327,auVar66);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar338,auVar67);
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar344,auVar63);
          pauVar35 = pauVar35 + 1;
          pauVar34 = pauVar34 + 2;
          lVar38 = lVar38 + 8;
        }
        for (; iVar48 + 3 < iVar28; iVar48 = iVar48 + 4) {
          uVar3 = *(undefined4 *)*pauVar35;
          auVar215._4_4_ = uVar3;
          auVar215._0_4_ = uVar3;
          auVar215._8_4_ = uVar3;
          auVar215._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 4);
          auVar215._20_4_ = uVar3;
          auVar215._16_4_ = uVar3;
          auVar215._24_4_ = uVar3;
          auVar215._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 8);
          auVar305._4_4_ = uVar3;
          auVar305._0_4_ = uVar3;
          auVar305._8_4_ = uVar3;
          auVar305._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0xc);
          auVar305._20_4_ = uVar3;
          auVar305._16_4_ = uVar3;
          auVar305._24_4_ = uVar3;
          auVar305._28_4_ = uVar3;
          auVar66 = vlddqu_avx(*pauVar34);
          auVar63 = vcvtph2ps_f16c(auVar66._0_16_);
          auVar66 = vcvtph2ps_f16c(auVar66._16_16_);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar215,auVar63);
          auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar305,auVar66);
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
          pauVar34 = pauVar34 + 1;
          lVar38 = lVar38 + 4;
        }
        for (; (int)lVar38 < iVar28; lVar38 = lVar38 + 1) {
          uVar3 = *(undefined4 *)(*local_358 + lVar38 * 4);
          auVar198._4_4_ = uVar3;
          auVar198._0_4_ = uVar3;
          auVar198._8_4_ = uVar3;
          auVar198._12_4_ = uVar3;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)((long)pvVar16 + lVar38 * 8 + sVar17 * uVar32 * lVar43);
          auVar112 = vcvtph2ps_f16c(auVar7);
          auVar74 = vfmadd231ps_fma(auVar74,auVar198,auVar112);
        }
        auVar77._0_4_ =
             auVar74._0_4_ + auVar80._0_4_ + auVar76._0_4_ + auVar202._0_4_ + auVar113._0_4_ + 0.0;
        auVar77._4_4_ =
             auVar74._4_4_ + auVar80._4_4_ + auVar76._4_4_ + auVar202._4_4_ + auVar113._4_4_ + 0.0;
        auVar77._8_4_ =
             auVar74._8_4_ + auVar80._8_4_ + auVar76._8_4_ + auVar202._8_4_ + auVar113._8_4_ + 0.0;
        auVar77._12_4_ =
             auVar74._12_4_ + auVar80._12_4_ + auVar76._12_4_ + auVar202._12_4_ + auVar113._12_4_ +
             0.0;
        auVar124 = auVar77;
        if (iVar31 - 1U < 6) {
          auVar74 = auVar71._0_16_;
          auVar124 = vmaxps_avx(auVar77,auVar74);
          auVar113 = auVar294._0_16_;
          fVar51 = auVar294._0_4_;
          fVar72 = auVar294._4_4_;
          fVar5 = auVar294._8_4_;
          fVar6 = auVar294._12_4_;
          switch(iVar31) {
          case 2:
            auVar74 = vminps_avx(auVar77,auVar74);
            uVar3 = *(this->super_InnerProduct).activation_params.data;
            auVar168._4_4_ = uVar3;
            auVar168._0_4_ = uVar3;
            auVar168._8_4_ = uVar3;
            auVar168._12_4_ = uVar3;
            auVar124 = vfmadd231ps_fma(auVar124,auVar74,auVar168);
            break;
          case 3:
            puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar3 = *puVar15;
            auVar118._4_4_ = uVar3;
            auVar118._0_4_ = uVar3;
            auVar118._8_4_ = uVar3;
            auVar118._12_4_ = uVar3;
            uVar3 = puVar15[1];
            auVar174._4_4_ = uVar3;
            auVar174._0_4_ = uVar3;
            auVar174._8_4_ = uVar3;
            auVar174._12_4_ = uVar3;
            auVar74 = vmaxps_avx(auVar77,auVar118);
            auVar124 = vminps_avx(auVar74,auVar174);
            break;
          case 4:
            uVar27 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
            auVar78._0_8_ = uVar27 ^ 0x8000000080000000;
            auVar78._8_4_ = -auVar77._8_4_;
            auVar78._12_4_ = -auVar77._12_4_;
            auVar119._8_4_ = 0x42b0c0a5;
            auVar119._0_8_ = 0x42b0c0a542b0c0a5;
            auVar119._12_4_ = 0x42b0c0a5;
            auVar74 = vminps_avx(auVar78,auVar119);
            auVar120._8_4_ = 0xc2b0c0a5;
            auVar120._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar120._12_4_ = 0xc2b0c0a5;
            auVar80 = vmaxps_avx(auVar74,auVar120);
            auVar121._8_4_ = 0x3fb8aa3b;
            auVar121._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar121._12_4_ = 0x3fb8aa3b;
            auVar55._8_4_ = 0x3f000000;
            auVar55._0_8_ = 0x3f0000003f000000;
            auVar55._12_4_ = 0x3f000000;
            auVar74 = vfmadd213ps_fma(auVar121,auVar80,auVar55);
            auVar175._0_4_ = (int)auVar74._0_4_;
            auVar175._4_4_ = (int)auVar74._4_4_;
            auVar175._8_4_ = (int)auVar74._8_4_;
            auVar175._12_4_ = (int)auVar74._12_4_;
            auVar202 = vcvtdq2ps_avx(auVar175);
            auVar74 = vcmpps_avx(auVar74,auVar202,1);
            auVar74 = vandps_avx(auVar74,auVar113);
            auVar74 = vsubps_avx(auVar202,auVar74);
            auVar176._8_4_ = 0x3f318000;
            auVar176._0_8_ = 0x3f3180003f318000;
            auVar176._12_4_ = 0x3f318000;
            auVar202 = vfmsub231ps_fma(auVar80,auVar74,auVar176);
            auVar177._8_4_ = 0x395e8083;
            auVar177._0_8_ = 0x395e8083395e8083;
            auVar177._12_4_ = 0x395e8083;
            auVar80 = vfmsub231ps_fma(auVar202,auVar74,auVar177);
            auVar178._0_4_ = auVar80._0_4_ * auVar80._0_4_;
            auVar178._4_4_ = auVar80._4_4_ * auVar80._4_4_;
            auVar178._8_4_ = auVar80._8_4_ * auVar80._8_4_;
            auVar178._12_4_ = auVar80._12_4_ * auVar80._12_4_;
            auVar206._8_4_ = 0x39506967;
            auVar206._0_8_ = 0x3950696739506967;
            auVar206._12_4_ = 0x39506967;
            auVar300._8_4_ = 0x3ab743ce;
            auVar300._0_8_ = 0x3ab743ce3ab743ce;
            auVar300._12_4_ = 0x3ab743ce;
            auVar202 = vfmadd213ps_fma(auVar206,auVar80,auVar300);
            auVar219._8_4_ = 0x3c088908;
            auVar219._0_8_ = 0x3c0889083c088908;
            auVar219._12_4_ = 0x3c088908;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar219);
            auVar220._8_4_ = 0x3d2aa9c1;
            auVar220._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar220._12_4_ = 0x3d2aa9c1;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar220);
            auVar221._8_4_ = 0x3e2aaaaa;
            auVar221._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar221._12_4_ = 0x3e2aaaaa;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar221);
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar55);
            auVar71 = ZEXT864(0) << 0x20;
            auVar202 = vfmadd213ps_fma(auVar202,auVar178,auVar80);
            auVar79._0_4_ = auVar202._0_4_ + fVar51;
            auVar79._4_4_ = auVar202._4_4_ + fVar72;
            auVar79._8_4_ = auVar202._8_4_ + fVar5;
            auVar79._12_4_ = auVar202._12_4_ + fVar6;
            auVar122._0_4_ = (int)auVar74._0_4_;
            auVar122._4_4_ = (int)auVar74._4_4_;
            auVar122._8_4_ = (int)auVar74._8_4_;
            auVar122._12_4_ = (int)auVar74._12_4_;
            auVar74 = vpslld_avx(auVar122,0x17);
            auVar74 = vpaddd_avx(auVar74,auVar113);
            auVar74 = vfmadd213ps_fma(auVar74,auVar79,auVar113);
            auVar124 = vdivps_avx(auVar113,auVar74);
            break;
          case 5:
            auVar330._8_4_ = 0x42b0c0a5;
            auVar330._0_8_ = 0x42b0c0a542b0c0a5;
            auVar330._12_4_ = 0x42b0c0a5;
            auVar74 = vminps_avx(auVar330,auVar77);
            auVar335._8_4_ = 0xc2b0c0a5;
            auVar335._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar335._12_4_ = 0xc2b0c0a5;
            auVar80 = vmaxps_avx(auVar335,auVar74);
            auVar340._8_4_ = 0x3fb8aa3b;
            auVar340._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar340._12_4_ = 0x3fb8aa3b;
            auVar331._8_4_ = 0x3f000000;
            auVar331._0_8_ = 0x3f0000003f000000;
            auVar331._12_4_ = 0x3f000000;
            auVar74 = vfmadd213ps_fma(auVar340,auVar80,auVar331);
            auVar199._0_4_ = (int)auVar74._0_4_;
            auVar199._4_4_ = (int)auVar74._4_4_;
            auVar199._8_4_ = (int)auVar74._8_4_;
            auVar199._12_4_ = (int)auVar74._12_4_;
            auVar202 = vcvtdq2ps_avx(auVar199);
            auVar74 = vcmpps_avx(auVar74,auVar202,1);
            auVar74 = vandps_avx(auVar74,auVar113);
            auVar74 = vsubps_avx(auVar202,auVar74);
            auVar347._8_4_ = 0x3f318000;
            auVar347._0_8_ = 0x3f3180003f318000;
            auVar347._12_4_ = 0x3f318000;
            auVar202 = vfmsub231ps_fma(auVar80,auVar74,auVar347);
            auVar249._8_4_ = 0xb95e8083;
            auVar249._0_8_ = 0xb95e8083b95e8083;
            auVar249._12_4_ = 0xb95e8083;
            auVar80 = vfnmsub231ps_fma(auVar202,auVar74,auVar249);
            auVar200._0_4_ = auVar80._0_4_ * auVar80._0_4_;
            auVar200._4_4_ = auVar80._4_4_ * auVar80._4_4_;
            auVar200._8_4_ = auVar80._8_4_ * auVar80._8_4_;
            auVar200._12_4_ = auVar80._12_4_ * auVar80._12_4_;
            auVar358._8_4_ = 0x39506967;
            auVar358._0_8_ = 0x3950696739506967;
            auVar358._12_4_ = 0x39506967;
            auVar353._8_4_ = 0x3ab743ce;
            auVar353._0_8_ = 0x3ab743ce3ab743ce;
            auVar353._12_4_ = 0x3ab743ce;
            auVar202 = vfmadd213ps_fma(auVar358,auVar80,auVar353);
            auVar218._8_4_ = 0x3c088908;
            auVar218._0_8_ = 0x3c0889083c088908;
            auVar218._12_4_ = 0x3c088908;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar218);
            auVar306._8_4_ = 0x3d2aa9c1;
            auVar306._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar306._12_4_ = 0x3d2aa9c1;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar306);
            auVar307._8_4_ = 0x3e2aaaaa;
            auVar307._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar307._12_4_ = 0x3e2aaaaa;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar307);
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar331);
            auVar202 = vfmadd213ps_fma(auVar202,auVar200,auVar80);
            auVar201._0_4_ = auVar202._0_4_ + fVar51;
            auVar201._4_4_ = auVar202._4_4_ + fVar72;
            auVar201._8_4_ = auVar202._8_4_ + fVar5;
            auVar201._12_4_ = auVar202._12_4_ + fVar6;
            auVar115._0_4_ = (int)auVar74._0_4_;
            auVar115._4_4_ = (int)auVar74._4_4_;
            auVar115._8_4_ = (int)auVar74._8_4_;
            auVar115._12_4_ = (int)auVar74._12_4_;
            auVar74 = vpslld_avx(auVar115,0x17);
            auVar74 = vpaddd_avx(auVar74,auVar113);
            auVar112 = vfmadd213ps_fma(auVar74,auVar201,auVar113);
            auVar169._8_4_ = 0x800000;
            auVar169._0_8_ = 0x80000000800000;
            auVar169._12_4_ = 0x800000;
            auVar74 = vmaxps_avx(auVar112,auVar169);
            auVar202 = vpsrld_avx(auVar74,0x17);
            auVar296._8_4_ = 0xffffff82;
            auVar296._0_8_ = 0xffffff82ffffff82;
            auVar296._12_4_ = 0xffffff82;
            auVar202 = vpaddd_avx(auVar202,auVar296);
            auVar297._8_4_ = 0x807fffff;
            auVar297._0_8_ = 0x807fffff807fffff;
            auVar297._12_4_ = 0x807fffff;
            auVar74 = vandps_avx(auVar74,auVar297);
            auVar76 = vorps_avx(auVar331,auVar74);
            auVar80 = vcvtdq2ps_avx(auVar202);
            auVar298._8_4_ = 0x3f3504f3;
            auVar298._0_8_ = 0x3f3504f33f3504f3;
            auVar298._12_4_ = 0x3f3504f3;
            auVar202 = vcmpps_avx(auVar76,auVar298,1);
            auVar74 = vandps_avx(auVar202,auVar76);
            auVar170._0_4_ = auVar74._0_4_ + auVar76._0_4_ + -1.0;
            auVar170._4_4_ = auVar74._4_4_ + auVar76._4_4_ + -1.0;
            auVar170._8_4_ = auVar74._8_4_ + auVar76._8_4_ + -1.0;
            auVar170._12_4_ = auVar74._12_4_ + auVar76._12_4_ + -1.0;
            auVar74 = vandps_avx(auVar202,auVar113);
            auVar202 = vsubps_avx(auVar80,auVar74);
            auVar299._0_4_ = auVar170._0_4_ * auVar170._0_4_;
            auVar299._4_4_ = auVar170._4_4_ * auVar170._4_4_;
            auVar299._8_4_ = auVar170._8_4_ * auVar170._8_4_;
            auVar299._12_4_ = auVar170._12_4_ * auVar170._12_4_;
            auVar308._8_4_ = 0x3d9021bb;
            auVar308._0_8_ = 0x3d9021bb3d9021bb;
            auVar308._12_4_ = 0x3d9021bb;
            auVar316._8_4_ = 0xbdebd1b8;
            auVar316._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar316._12_4_ = 0xbdebd1b8;
            auVar74 = vfmadd213ps_fma(auVar308,auVar170,auVar316);
            auVar317._8_4_ = 0x3def251a;
            auVar317._0_8_ = 0x3def251a3def251a;
            auVar317._12_4_ = 0x3def251a;
            auVar74 = vfmadd213ps_fma(auVar74,auVar170,auVar317);
            auVar318._8_4_ = 0xbdfe5d4f;
            auVar318._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar318._12_4_ = 0xbdfe5d4f;
            auVar74 = vfmadd213ps_fma(auVar74,auVar170,auVar318);
            auVar319._8_4_ = 0x3e11e9bf;
            auVar319._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar319._12_4_ = 0x3e11e9bf;
            auVar74 = vfmadd213ps_fma(auVar74,auVar170,auVar319);
            auVar320._8_4_ = 0xbe2aae50;
            auVar320._0_8_ = 0xbe2aae50be2aae50;
            auVar320._12_4_ = 0xbe2aae50;
            auVar74 = vfmadd213ps_fma(auVar74,auVar170,auVar320);
            auVar321._8_4_ = 0x3e4cceac;
            auVar321._0_8_ = 0x3e4cceac3e4cceac;
            auVar321._12_4_ = 0x3e4cceac;
            auVar74 = vfmadd213ps_fma(auVar74,auVar170,auVar321);
            auVar322._8_4_ = 0xbe7ffffc;
            auVar322._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar322._12_4_ = 0xbe7ffffc;
            auVar74 = vfmadd213ps_fma(auVar74,auVar170,auVar322);
            auVar323._8_4_ = 0x3eaaaaaa;
            auVar323._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar323._12_4_ = 0x3eaaaaaa;
            auVar74 = vfmadd213ps_fma(auVar74,auVar170,auVar323);
            auVar309._0_4_ = auVar299._0_4_ * auVar170._0_4_ * auVar74._0_4_;
            auVar309._4_4_ = auVar299._4_4_ * auVar170._4_4_ * auVar74._4_4_;
            auVar309._8_4_ = auVar299._8_4_ * auVar170._8_4_ * auVar74._8_4_;
            auVar309._12_4_ = auVar299._12_4_ * auVar170._12_4_ * auVar74._12_4_;
            auVar74 = vfmadd231ps_fma(auVar309,auVar202,auVar249);
            auVar80 = vfmsub231ps_fma(auVar74,auVar331,auVar299);
            auVar74 = vcmpps_avx(auVar112,_DAT_00537070,2);
            auVar80 = vsubps_avx(auVar80,auVar170);
            auVar202 = vfnmadd231ps_fma(auVar80,auVar347,auVar202);
            auVar171._0_4_ = auVar202._0_4_ + auVar202._0_4_;
            auVar171._4_4_ = auVar202._4_4_ + auVar202._4_4_;
            auVar171._8_4_ = auVar202._8_4_ + auVar202._8_4_;
            auVar171._12_4_ = auVar202._12_4_ + auVar202._12_4_;
            auVar203._8_4_ = 0x7fffffff;
            auVar203._0_8_ = 0x7fffffff7fffffff;
            auVar203._12_4_ = 0x7fffffff;
            auVar74 = vblendvps_avx(auVar171,auVar203,auVar74);
            auVar172._8_4_ = 0x42b0c0a5;
            auVar172._0_8_ = 0x42b0c0a542b0c0a5;
            auVar172._12_4_ = 0x42b0c0a5;
            auVar74 = vminps_avx(auVar74,auVar172);
            auVar80 = vmaxps_avx(auVar335,auVar74);
            auVar74 = vfmadd213ps_fma(auVar340,auVar80,auVar331);
            auVar204._0_4_ = (int)auVar74._0_4_;
            auVar204._4_4_ = (int)auVar74._4_4_;
            auVar204._8_4_ = (int)auVar74._8_4_;
            auVar204._12_4_ = (int)auVar74._12_4_;
            auVar202 = vcvtdq2ps_avx(auVar204);
            auVar74 = vcmpps_avx(auVar74,auVar202,1);
            auVar74 = vandps_avx(auVar74,auVar113);
            auVar74 = vsubps_avx(auVar202,auVar74);
            auVar202 = vfmsub231ps_fma(auVar80,auVar74,auVar347);
            auVar80 = vfnmsub231ps_fma(auVar202,auVar74,auVar249);
            auVar294 = ZEXT1664(auVar113);
            auVar205._0_4_ = auVar80._0_4_ * auVar80._0_4_;
            auVar205._4_4_ = auVar80._4_4_ * auVar80._4_4_;
            auVar205._8_4_ = auVar80._8_4_ * auVar80._8_4_;
            auVar205._12_4_ = auVar80._12_4_ * auVar80._12_4_;
            auVar202 = vfmadd213ps_fma(auVar358,auVar80,auVar353);
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar218);
            auVar53._8_4_ = 0x3d2aa9c1;
            auVar53._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar53._12_4_ = 0x3d2aa9c1;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar53);
            auVar54._8_4_ = 0x3e2aaaaa;
            auVar54._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar54._12_4_ = 0x3e2aaaaa;
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar54);
            auVar202 = vfmadd213ps_fma(auVar202,auVar80,auVar331);
            auVar71 = ZEXT864(0);
            auVar202 = vfmadd213ps_fma(auVar202,auVar205,auVar80);
            auVar116._0_4_ = auVar202._0_4_ + fVar51;
            auVar116._4_4_ = auVar202._4_4_ + fVar72;
            auVar116._8_4_ = auVar202._8_4_ + fVar5;
            auVar116._12_4_ = auVar202._12_4_ + fVar6;
            auVar173._0_4_ = (int)auVar74._0_4_;
            auVar173._4_4_ = (int)auVar74._4_4_;
            auVar173._8_4_ = (int)auVar74._8_4_;
            auVar173._12_4_ = (int)auVar74._12_4_;
            auVar74 = vpslld_avx(auVar173,0x17);
            auVar74 = vpaddd_avx(auVar74,auVar113);
            auVar74 = vfmadd213ps_fma(auVar74,auVar116,auVar113);
            auVar117._8_4_ = 0x40000000;
            auVar117._0_8_ = 0x4000000040000000;
            auVar117._12_4_ = 0x40000000;
            auVar74 = vdivps_avx(auVar117,auVar74);
            auVar124 = vfmsub213ps_fma(auVar74,auVar77,auVar77);
            break;
          case 6:
            puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar3 = *puVar15;
            auVar123._4_4_ = uVar3;
            auVar123._0_4_ = uVar3;
            auVar123._8_4_ = uVar3;
            auVar123._12_4_ = uVar3;
            uVar3 = puVar15[1];
            auVar179._4_4_ = uVar3;
            auVar179._0_4_ = uVar3;
            auVar179._8_4_ = uVar3;
            auVar179._12_4_ = uVar3;
            auVar202 = vfmadd231ps_fma(auVar179,auVar77,auVar123);
            auVar74 = vmaxps_avx(auVar202,auVar74);
            auVar74 = vminps_avx(auVar74,auVar113);
            auVar124._0_4_ = auVar74._0_4_ * auVar77._0_4_;
            auVar124._4_4_ = auVar74._4_4_ * auVar77._4_4_;
            auVar124._8_4_ = auVar74._8_4_ * auVar77._8_4_;
            auVar124._12_4_ = auVar74._12_4_ * auVar77._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar32 * 0x10) = auVar124;
      }
    }
    else if (iVar48 == 8) {
      iVar48 = 0;
      uVar33 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar33 = 0;
      }
      for (uVar32 = 0; uVar32 != uVar33; uVar32 = uVar32 + 1) {
        auVar74 = ZEXT816(0) << 0x40;
        auVar71 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar14 != (void *)0x0) {
          auVar71 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar14 + uVar32 * 0x20));
        }
        pauVar34 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar32 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        lVar38 = 0;
        auVar56 = ZEXT816(0) << 0x40;
        auVar112 = ZEXT816(0) << 0x40;
        auVar76 = ZEXT816(0) << 0x40;
        auVar80 = ZEXT816(0) << 0x40;
        auVar202 = ZEXT816(0) << 0x40;
        auVar113 = ZEXT816(0) << 0x40;
        iVar40 = 0;
        pauVar35 = local_358;
        while( true ) {
          if (iVar28 <= iVar40 + 7) break;
          uVar3 = *(undefined4 *)*pauVar35;
          auVar342._4_4_ = uVar3;
          auVar342._0_4_ = uVar3;
          auVar342._8_4_ = uVar3;
          auVar342._12_4_ = uVar3;
          auVar342._16_4_ = uVar3;
          auVar342._20_4_ = uVar3;
          auVar342._24_4_ = uVar3;
          auVar342._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 4);
          auVar349._4_4_ = uVar3;
          auVar349._0_4_ = uVar3;
          auVar349._8_4_ = uVar3;
          auVar349._12_4_ = uVar3;
          auVar349._16_4_ = uVar3;
          auVar349._20_4_ = uVar3;
          auVar349._24_4_ = uVar3;
          auVar349._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 8);
          auVar325._4_4_ = uVar3;
          auVar325._0_4_ = uVar3;
          auVar325._8_4_ = uVar3;
          auVar325._12_4_ = uVar3;
          auVar325._16_4_ = uVar3;
          auVar325._20_4_ = uVar3;
          auVar325._24_4_ = uVar3;
          auVar325._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0xc);
          auVar262._4_4_ = uVar3;
          auVar262._0_4_ = uVar3;
          auVar262._8_4_ = uVar3;
          auVar262._12_4_ = uVar3;
          auVar262._16_4_ = uVar3;
          auVar262._20_4_ = uVar3;
          auVar262._24_4_ = uVar3;
          auVar262._28_4_ = uVar3;
          auVar66 = vlddqu_avx(*pauVar34);
          auVar63 = vlddqu_avx(pauVar34[1]);
          auVar111 = vcvtph2ps_f16c(auVar66._0_16_);
          auVar66 = vcvtph2ps_f16c(auVar66._16_16_);
          auVar67 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar125 = vfmadd231ps_fma(auVar71._0_32_,auVar342,auVar111);
          auVar71 = ZEXT1664(auVar125);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar349,auVar66);
          auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar325,auVar67);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar262,auVar63);
          uVar3 = *(undefined4 *)(*pauVar35 + 0x10);
          auVar187._4_4_ = uVar3;
          auVar187._0_4_ = uVar3;
          auVar187._8_4_ = uVar3;
          auVar187._12_4_ = uVar3;
          auVar187._16_4_ = uVar3;
          auVar187._20_4_ = uVar3;
          auVar187._24_4_ = uVar3;
          auVar187._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0x14);
          auVar229._4_4_ = uVar3;
          auVar229._0_4_ = uVar3;
          auVar229._8_4_ = uVar3;
          auVar229._12_4_ = uVar3;
          auVar229._16_4_ = uVar3;
          auVar229._20_4_ = uVar3;
          auVar229._24_4_ = uVar3;
          auVar229._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0x18);
          auVar263._4_4_ = uVar3;
          auVar263._0_4_ = uVar3;
          auVar263._8_4_ = uVar3;
          auVar263._12_4_ = uVar3;
          auVar263._16_4_ = uVar3;
          auVar263._20_4_ = uVar3;
          auVar263._24_4_ = uVar3;
          auVar263._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0x1c);
          auVar302._4_4_ = uVar3;
          auVar302._0_4_ = uVar3;
          auVar302._8_4_ = uVar3;
          auVar302._12_4_ = uVar3;
          auVar302._16_4_ = uVar3;
          auVar302._20_4_ = uVar3;
          auVar302._24_4_ = uVar3;
          auVar302._28_4_ = uVar3;
          auVar66 = vlddqu_avx(pauVar34[2]);
          auVar63 = vlddqu_avx(pauVar34[3]);
          auVar111 = vcvtph2ps_f16c(auVar66._0_16_);
          auVar66 = vcvtph2ps_f16c(auVar66._16_16_);
          auVar67 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar187,auVar111);
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar229,auVar66);
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar263,auVar67);
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar302,auVar63);
          pauVar35 = pauVar35 + 1;
          pauVar34 = pauVar34 + 4;
          iVar40 = iVar40 + 8;
          lVar38 = lVar38 + 8;
        }
        for (; iVar40 + 3 < iVar28; iVar40 = iVar40 + 4) {
          uVar3 = *(undefined4 *)*pauVar35;
          auVar188._4_4_ = uVar3;
          auVar188._0_4_ = uVar3;
          auVar188._8_4_ = uVar3;
          auVar188._12_4_ = uVar3;
          auVar188._16_4_ = uVar3;
          auVar188._20_4_ = uVar3;
          auVar188._24_4_ = uVar3;
          auVar188._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 4);
          auVar230._4_4_ = uVar3;
          auVar230._0_4_ = uVar3;
          auVar230._8_4_ = uVar3;
          auVar230._12_4_ = uVar3;
          auVar230._16_4_ = uVar3;
          auVar230._20_4_ = uVar3;
          auVar230._24_4_ = uVar3;
          auVar230._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 8);
          auVar264._4_4_ = uVar3;
          auVar264._0_4_ = uVar3;
          auVar264._8_4_ = uVar3;
          auVar264._12_4_ = uVar3;
          auVar264._16_4_ = uVar3;
          auVar264._20_4_ = uVar3;
          auVar264._24_4_ = uVar3;
          auVar264._28_4_ = uVar3;
          uVar3 = *(undefined4 *)(*pauVar35 + 0xc);
          auVar303._4_4_ = uVar3;
          auVar303._0_4_ = uVar3;
          auVar303._8_4_ = uVar3;
          auVar303._12_4_ = uVar3;
          auVar303._16_4_ = uVar3;
          auVar303._20_4_ = uVar3;
          auVar303._24_4_ = uVar3;
          auVar303._28_4_ = uVar3;
          auVar66 = vlddqu_avx(*pauVar34);
          auVar63 = vlddqu_avx(pauVar34[1]);
          auVar111 = vcvtph2ps_f16c(auVar66._0_16_);
          auVar66 = vcvtph2ps_f16c(auVar66._16_16_);
          auVar67 = vcvtph2ps_f16c(auVar63._0_16_);
          auVar63 = vcvtph2ps_f16c(auVar63._16_16_);
          auVar125 = vfmadd231ps_fma(auVar71._0_32_,auVar188,auVar111);
          auVar71 = ZEXT1664(auVar125);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar230,auVar66);
          auVar202 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar264,auVar67);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar303,auVar63);
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
          pauVar34 = pauVar34 + 2;
          lVar38 = lVar38 + 4;
        }
        for (; (int)lVar38 < iVar28; lVar38 = lVar38 + 1) {
          uVar3 = *(undefined4 *)(*local_358 + lVar38 * 4);
          auVar189._4_4_ = uVar3;
          auVar189._0_4_ = uVar3;
          auVar189._8_4_ = uVar3;
          auVar189._12_4_ = uVar3;
          auVar189._16_4_ = uVar3;
          auVar189._20_4_ = uVar3;
          auVar189._24_4_ = uVar3;
          auVar189._28_4_ = uVar3;
          auVar125 = vlddqu_avx(*(undefined1 (*) [16])*pauVar34);
          auVar66 = vcvtph2ps_f16c(auVar125);
          auVar125 = vfmadd231ps_fma(auVar71._0_32_,auVar189,auVar66);
          auVar71 = ZEXT1664(auVar125);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
        }
        fVar51 = auVar74._0_4_ + auVar56._0_4_ + auVar112._0_4_ + auVar76._0_4_ +
                 auVar113._0_4_ + auVar80._0_4_ + auVar202._0_4_ + auVar71._0_4_;
        fVar72 = auVar74._4_4_ + auVar56._4_4_ + auVar112._4_4_ + auVar76._4_4_ +
                 auVar113._4_4_ + auVar80._4_4_ + auVar202._4_4_ + auVar71._4_4_;
        auVar61._0_8_ = CONCAT44(fVar72,fVar51);
        auVar61._8_4_ =
             auVar74._8_4_ + auVar56._8_4_ + auVar112._8_4_ + auVar76._8_4_ +
             auVar113._8_4_ + auVar80._8_4_ + auVar202._8_4_ + auVar71._8_4_;
        auVar61._12_4_ =
             auVar74._12_4_ + auVar56._12_4_ + auVar112._12_4_ + auVar76._12_4_ +
             auVar113._12_4_ + auVar80._12_4_ + auVar202._12_4_ + auVar71._12_4_;
        auVar61._16_4_ = auVar71._16_4_ + 0.0;
        auVar61._20_4_ = auVar71._20_4_ + 0.0;
        auVar61._24_4_ = auVar71._24_4_ + 0.0;
        auVar61._28_4_ = auVar71._28_4_ + 0.0;
        auVar66 = auVar61;
        if (5 < iVar31 - 1U) goto switchD_002c2551_caseD_1;
        auVar66 = vmaxps_avx(auVar61,ZEXT832(0) << 0x20);
        switch(iVar31) {
        case 2:
          auVar63 = vminps_avx(auVar61,ZEXT832(0) << 0x20);
          uVar3 = *(this->super_InnerProduct).activation_params.data;
          auVar141._4_4_ = uVar3;
          auVar141._0_4_ = uVar3;
          auVar141._8_4_ = uVar3;
          auVar141._12_4_ = uVar3;
          auVar141._16_4_ = uVar3;
          auVar141._20_4_ = uVar3;
          auVar141._24_4_ = uVar3;
          auVar141._28_4_ = uVar3;
          auVar74 = vfmadd231ps_fma(auVar66,auVar63,auVar141);
          auVar66 = ZEXT1632(auVar74);
          break;
        case 3:
          puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar3 = *puVar15;
          auVar96._4_4_ = uVar3;
          auVar96._0_4_ = uVar3;
          auVar96._8_4_ = uVar3;
          auVar96._12_4_ = uVar3;
          auVar96._16_4_ = uVar3;
          auVar96._20_4_ = uVar3;
          auVar96._24_4_ = uVar3;
          auVar96._28_4_ = uVar3;
          uVar3 = puVar15[1];
          auVar150._4_4_ = uVar3;
          auVar150._0_4_ = uVar3;
          auVar150._8_4_ = uVar3;
          auVar150._12_4_ = uVar3;
          auVar150._16_4_ = uVar3;
          auVar150._20_4_ = uVar3;
          auVar150._24_4_ = uVar3;
          auVar150._28_4_ = uVar3;
          auVar66 = vmaxps_avx(auVar61,auVar96);
          auVar66 = vminps_avx(auVar66,auVar150);
          break;
        case 4:
          auVar62._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
          auVar62._8_4_ = -auVar61._8_4_;
          auVar62._12_4_ = -auVar61._12_4_;
          auVar62._16_4_ = -auVar61._16_4_;
          auVar62._20_4_ = -auVar61._20_4_;
          auVar62._24_4_ = -auVar61._24_4_;
          auVar62._28_4_ = -auVar61._28_4_;
          auVar97._8_4_ = 0x42b0c0a5;
          auVar97._0_8_ = 0x42b0c0a542b0c0a5;
          auVar97._12_4_ = 0x42b0c0a5;
          auVar97._16_4_ = 0x42b0c0a5;
          auVar97._20_4_ = 0x42b0c0a5;
          auVar97._24_4_ = 0x42b0c0a5;
          auVar97._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar62,auVar97);
          auVar98._8_4_ = 0xc2b0c0a5;
          auVar98._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar98._12_4_ = 0xc2b0c0a5;
          auVar98._16_4_ = 0xc2b0c0a5;
          auVar98._20_4_ = 0xc2b0c0a5;
          auVar98._24_4_ = 0xc2b0c0a5;
          auVar98._28_4_ = 0xc2b0c0a5;
          auVar63 = vmaxps_avx(auVar66,auVar98);
          auVar99._8_4_ = 0x3fb8aa3b;
          auVar99._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar99._12_4_ = 0x3fb8aa3b;
          auVar99._16_4_ = 0x3fb8aa3b;
          auVar99._20_4_ = 0x3fb8aa3b;
          auVar99._24_4_ = 0x3fb8aa3b;
          auVar99._28_4_ = 0x3fb8aa3b;
          auVar213._8_4_ = 0x3f000000;
          auVar213._0_8_ = 0x3f0000003f000000;
          auVar213._12_4_ = 0x3f000000;
          auVar213._16_4_ = 0x3f000000;
          auVar213._20_4_ = 0x3f000000;
          auVar213._24_4_ = 0x3f000000;
          auVar213._28_4_ = 0x3f000000;
          auVar74 = vfmadd213ps_fma(auVar99,auVar63,auVar213);
          auVar111 = vroundps_avx(ZEXT1632(auVar74),1);
          auVar66 = vcmpps_avx(ZEXT1632(auVar74),auVar111,1);
          auVar238._8_4_ = 0x3f800000;
          auVar238._0_8_ = 0x3f8000003f800000;
          auVar238._12_4_ = 0x3f800000;
          auVar238._16_4_ = 0x3f800000;
          auVar238._20_4_ = 0x3f800000;
          auVar238._24_4_ = 0x3f800000;
          auVar238._28_4_ = 0x3f800000;
          auVar66 = vandps_avx(auVar66,auVar238);
          auVar66 = vsubps_avx(auVar111,auVar66);
          auVar151._8_4_ = 0x3f318000;
          auVar151._0_8_ = 0x3f3180003f318000;
          auVar151._12_4_ = 0x3f318000;
          auVar151._16_4_ = 0x3f318000;
          auVar151._20_4_ = 0x3f318000;
          auVar151._24_4_ = 0x3f318000;
          auVar151._28_4_ = 0x3f318000;
          auVar74 = vfmsub231ps_fma(auVar63,auVar66,auVar151);
          auVar152._8_4_ = 0x395e8083;
          auVar152._0_8_ = 0x395e8083395e8083;
          auVar152._12_4_ = 0x395e8083;
          auVar152._16_4_ = 0x395e8083;
          auVar152._20_4_ = 0x395e8083;
          auVar152._24_4_ = 0x395e8083;
          auVar152._28_4_ = 0x395e8083;
          auVar113 = vfmsub231ps_fma(ZEXT1632(auVar74),auVar66,auVar152);
          auVar63 = ZEXT1632(auVar113);
          auVar22._28_4_ = 0x395e8083;
          auVar22._0_28_ =
               ZEXT1628(CONCAT412(auVar113._12_4_ * auVar113._12_4_,
                                  CONCAT48(auVar113._8_4_ * auVar113._8_4_,
                                           CONCAT44(auVar113._4_4_ * auVar113._4_4_,
                                                    auVar113._0_4_ * auVar113._0_4_))));
          auVar193._8_4_ = 0x39506967;
          auVar193._0_8_ = 0x3950696739506967;
          auVar193._12_4_ = 0x39506967;
          auVar193._16_4_ = 0x39506967;
          auVar193._20_4_ = 0x39506967;
          auVar193._24_4_ = 0x39506967;
          auVar193._28_4_ = 0x39506967;
          auVar275._8_4_ = 0x3ab743ce;
          auVar275._0_8_ = 0x3ab743ce3ab743ce;
          auVar275._12_4_ = 0x3ab743ce;
          auVar275._16_4_ = 0x3ab743ce;
          auVar275._20_4_ = 0x3ab743ce;
          auVar275._24_4_ = 0x3ab743ce;
          auVar275._28_4_ = 0x3ab743ce;
          auVar74 = vfmadd213ps_fma(auVar193,auVar63,auVar275);
          auVar276._8_4_ = 0x3c088908;
          auVar276._0_8_ = 0x3c0889083c088908;
          auVar276._12_4_ = 0x3c088908;
          auVar276._16_4_ = 0x3c088908;
          auVar276._20_4_ = 0x3c088908;
          auVar276._24_4_ = 0x3c088908;
          auVar276._28_4_ = 0x3c088908;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar276);
          auVar277._8_4_ = 0x3d2aa9c1;
          auVar277._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar277._12_4_ = 0x3d2aa9c1;
          auVar277._16_4_ = 0x3d2aa9c1;
          auVar277._20_4_ = 0x3d2aa9c1;
          auVar277._24_4_ = 0x3d2aa9c1;
          auVar277._28_4_ = 0x3d2aa9c1;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar277);
          auVar278._8_4_ = 0x3e2aaaaa;
          auVar278._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar278._12_4_ = 0x3e2aaaaa;
          auVar278._16_4_ = 0x3e2aaaaa;
          auVar278._20_4_ = 0x3e2aaaaa;
          auVar278._24_4_ = 0x3e2aaaaa;
          auVar278._28_4_ = 0x3e2aaaaa;
          auVar63 = ZEXT1632(auVar113);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar278);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar213);
          auVar202 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar22,auVar63);
          auVar52._0_4_ = (int)auVar66._0_4_;
          auVar52._4_4_ = (int)auVar66._4_4_;
          auVar52._8_4_ = (int)auVar66._8_4_;
          auVar52._12_4_ = (int)auVar66._12_4_;
          auVar64._16_4_ = (int)auVar66._16_4_;
          auVar64._0_16_ = auVar52;
          auVar64._20_4_ = (int)auVar66._20_4_;
          auVar64._24_4_ = (int)auVar66._24_4_;
          auVar64._28_4_ = (int)auVar66._28_4_;
          auVar113 = vpslld_avx(auVar52,0x17);
          auVar74 = vpslld_avx(auVar64._16_16_,0x17);
          auVar114._8_4_ = 0x3f800000;
          auVar114._0_8_ = 0x3f8000003f800000;
          auVar114._12_4_ = 0x3f800000;
          auVar74 = vpaddd_avx(auVar74,auVar114);
          auVar113 = vpaddd_avx(auVar113,auVar114);
          auVar65._16_16_ = auVar74;
          auVar65._0_16_ = auVar113;
          auVar100._0_4_ = auVar202._0_4_ + 1.0;
          auVar100._4_4_ = auVar202._4_4_ + 1.0;
          auVar100._8_4_ = auVar202._8_4_ + 1.0;
          auVar100._12_4_ = auVar202._12_4_ + 1.0;
          auVar100._16_4_ = 0x3f800000;
          auVar100._20_4_ = 0x3f800000;
          auVar100._24_4_ = 0x3f800000;
          auVar100._28_4_ = 0x3f800000;
          auVar74 = vfmadd213ps_fma(auVar65,auVar100,auVar238);
          auVar66 = vdivps_avx(auVar238,ZEXT1632(auVar74));
          break;
        case 5:
          auVar304._8_4_ = 0x42b0c0a5;
          auVar304._0_8_ = 0x42b0c0a542b0c0a5;
          auVar304._12_4_ = 0x42b0c0a5;
          auVar304._16_4_ = 0x42b0c0a5;
          auVar304._20_4_ = 0x42b0c0a5;
          auVar304._24_4_ = 0x42b0c0a5;
          auVar304._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar61,auVar304);
          auVar312._8_4_ = 0xc2b0c0a5;
          auVar312._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar312._12_4_ = 0xc2b0c0a5;
          auVar312._16_4_ = 0xc2b0c0a5;
          auVar312._20_4_ = 0xc2b0c0a5;
          auVar312._24_4_ = 0xc2b0c0a5;
          auVar312._28_4_ = 0xc2b0c0a5;
          auVar63 = vmaxps_avx(auVar312,auVar66);
          auVar142._8_4_ = 0x3fb8aa3b;
          auVar142._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar142._12_4_ = 0x3fb8aa3b;
          auVar142._16_4_ = 0x3fb8aa3b;
          auVar142._20_4_ = 0x3fb8aa3b;
          auVar142._24_4_ = 0x3fb8aa3b;
          auVar142._28_4_ = 0x3fb8aa3b;
          auVar326._8_4_ = 0x3f000000;
          auVar326._0_8_ = 0x3f0000003f000000;
          auVar326._12_4_ = 0x3f000000;
          auVar326._16_4_ = 0x3f000000;
          auVar326._20_4_ = 0x3f000000;
          auVar326._24_4_ = 0x3f000000;
          auVar326._28_4_ = 0x3f000000;
          auVar74 = vfmadd213ps_fma(auVar142,auVar63,auVar326);
          auVar111 = vroundps_avx(ZEXT1632(auVar74),1);
          auVar66 = vcmpps_avx(ZEXT1632(auVar74),auVar111,1);
          auVar337._8_4_ = 0x3f800000;
          auVar337._0_8_ = 0x3f8000003f800000;
          auVar337._12_4_ = 0x3f800000;
          auVar337._16_4_ = 0x3f800000;
          auVar337._20_4_ = 0x3f800000;
          auVar337._24_4_ = 0x3f800000;
          auVar337._28_4_ = 0x3f800000;
          auVar66 = vandps_avx(auVar337,auVar66);
          auVar66 = vsubps_avx(auVar111,auVar66);
          auVar343._8_4_ = 0x3f318000;
          auVar343._0_8_ = 0x3f3180003f318000;
          auVar343._12_4_ = 0x3f318000;
          auVar343._16_4_ = 0x3f318000;
          auVar343._20_4_ = 0x3f318000;
          auVar343._24_4_ = 0x3f318000;
          auVar343._28_4_ = 0x3f318000;
          auVar74 = vfmsub231ps_fma(auVar63,auVar66,auVar343);
          auVar313._8_4_ = 0xb95e8083;
          auVar313._0_8_ = 0xb95e8083b95e8083;
          auVar313._12_4_ = 0xb95e8083;
          auVar313._16_4_ = 0xb95e8083;
          auVar313._20_4_ = 0xb95e8083;
          auVar313._24_4_ = 0xb95e8083;
          auVar313._28_4_ = 0xb95e8083;
          auVar113 = vfnmsub231ps_fma(ZEXT1632(auVar74),auVar66,auVar313);
          auVar63 = ZEXT1632(auVar113);
          auVar20._28_4_ = auVar111._28_4_;
          auVar20._0_28_ =
               ZEXT1628(CONCAT412(auVar113._12_4_ * auVar113._12_4_,
                                  CONCAT48(auVar113._8_4_ * auVar113._8_4_,
                                           CONCAT44(auVar113._4_4_ * auVar113._4_4_,
                                                    auVar113._0_4_ * auVar113._0_4_))));
          auVar355._8_4_ = 0x39506967;
          auVar355._0_8_ = 0x3950696739506967;
          auVar355._12_4_ = 0x39506967;
          auVar355._16_4_ = 0x39506967;
          auVar355._20_4_ = 0x39506967;
          auVar355._24_4_ = 0x39506967;
          auVar355._28_4_ = 0x39506967;
          auVar350._8_4_ = 0x3ab743ce;
          auVar350._0_8_ = 0x3ab743ce3ab743ce;
          auVar350._12_4_ = 0x3ab743ce;
          auVar350._16_4_ = 0x3ab743ce;
          auVar350._20_4_ = 0x3ab743ce;
          auVar350._24_4_ = 0x3ab743ce;
          auVar350._28_4_ = 0x3ab743ce;
          auVar74 = vfmadd213ps_fma(auVar355,auVar63,auVar350);
          auVar360._8_4_ = 0x3c088908;
          auVar360._0_8_ = 0x3c0889083c088908;
          auVar360._12_4_ = 0x3c088908;
          auVar360._16_4_ = 0x3c088908;
          auVar360._20_4_ = 0x3c088908;
          auVar360._24_4_ = 0x3c088908;
          auVar360._28_4_ = 0x3c088908;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar360);
          auVar231._8_4_ = 0x3d2aa9c1;
          auVar231._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar231._12_4_ = 0x3d2aa9c1;
          auVar231._16_4_ = 0x3d2aa9c1;
          auVar231._20_4_ = 0x3d2aa9c1;
          auVar231._24_4_ = 0x3d2aa9c1;
          auVar231._28_4_ = 0x3d2aa9c1;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar231);
          auVar232._8_4_ = 0x3e2aaaaa;
          auVar232._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar232._12_4_ = 0x3e2aaaaa;
          auVar232._16_4_ = 0x3e2aaaaa;
          auVar232._20_4_ = 0x3e2aaaaa;
          auVar232._24_4_ = 0x3e2aaaaa;
          auVar232._28_4_ = 0x3e2aaaaa;
          auVar63 = ZEXT1632(auVar113);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar232);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar326);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar20,auVar63);
          auVar190._0_4_ = auVar74._0_4_ + 1.0;
          auVar190._4_4_ = auVar74._4_4_ + 1.0;
          auVar190._8_4_ = auVar74._8_4_ + 1.0;
          auVar190._12_4_ = auVar74._12_4_ + 1.0;
          auVar190._16_4_ = 0x3f800000;
          auVar190._20_4_ = 0x3f800000;
          auVar190._24_4_ = 0x3f800000;
          auVar190._28_4_ = 0x3f800000;
          auVar73._0_4_ = (int)auVar66._0_4_;
          auVar73._4_4_ = (int)auVar66._4_4_;
          auVar73._8_4_ = (int)auVar66._8_4_;
          auVar73._12_4_ = (int)auVar66._12_4_;
          auVar92._16_4_ = (int)auVar66._16_4_;
          auVar92._0_16_ = auVar73;
          auVar92._20_4_ = (int)auVar66._20_4_;
          auVar92._24_4_ = (int)auVar66._24_4_;
          auVar92._28_4_ = (int)auVar66._28_4_;
          auVar113 = vpslld_avx(auVar73,0x17);
          auVar74 = vpslld_avx(auVar92._16_16_,0x17);
          auVar295._8_4_ = 0x3f800000;
          auVar295._0_8_ = 0x3f8000003f800000;
          auVar295._12_4_ = 0x3f800000;
          auVar74 = vpaddd_avx(auVar74,auVar295);
          auVar113 = vpaddd_avx(auVar113,auVar295);
          auVar93._16_16_ = auVar74;
          auVar93._0_16_ = auVar113;
          auVar202 = vfmadd213ps_fma(auVar93,auVar190,auVar337);
          auVar143._8_4_ = 0x800000;
          auVar143._0_8_ = 0x80000000800000;
          auVar143._12_4_ = 0x800000;
          auVar143._16_4_ = 0x800000;
          auVar143._20_4_ = 0x800000;
          auVar143._24_4_ = 0x800000;
          auVar143._28_4_ = 0x800000;
          auVar66 = vmaxps_avx(ZEXT1632(auVar202),auVar143);
          auVar113 = vpsrld_avx(auVar66._0_16_,0x17);
          auVar74 = vpsrld_avx(auVar66._16_16_,0x17);
          auVar233._8_4_ = 0x807fffff;
          auVar233._0_8_ = 0x807fffff807fffff;
          auVar233._12_4_ = 0x807fffff;
          auVar233._16_4_ = 0x807fffff;
          auVar233._20_4_ = 0x807fffff;
          auVar233._24_4_ = 0x807fffff;
          auVar233._28_4_ = 0x807fffff;
          auVar66 = vandps_avx(auVar66,auVar233);
          auVar111 = vorps_avx(auVar326,auVar66);
          auVar234._8_4_ = 0x3f3504f3;
          auVar234._0_8_ = 0x3f3504f33f3504f3;
          auVar234._12_4_ = 0x3f3504f3;
          auVar234._16_4_ = 0x3f3504f3;
          auVar234._20_4_ = 0x3f3504f3;
          auVar234._24_4_ = 0x3f3504f3;
          auVar234._28_4_ = 0x3f3504f3;
          auVar63 = vcmpps_avx(auVar234,auVar111,2);
          auVar66 = vandnps_avx(auVar63,auVar111);
          auVar333._8_4_ = 0xbf800000;
          auVar333._0_8_ = 0xbf800000bf800000;
          auVar333._12_4_ = 0xbf800000;
          auVar333._16_4_ = 0xbf800000;
          auVar333._20_4_ = 0xbf800000;
          auVar333._24_4_ = 0xbf800000;
          auVar333._28_4_ = 0xbf800000;
          auVar144._0_4_ = auVar111._0_4_ + -1.0 + auVar66._0_4_;
          auVar144._4_4_ = auVar111._4_4_ + -1.0 + auVar66._4_4_;
          auVar144._8_4_ = auVar111._8_4_ + -1.0 + auVar66._8_4_;
          auVar144._12_4_ = auVar111._12_4_ + -1.0 + auVar66._12_4_;
          auVar144._16_4_ = auVar111._16_4_ + -1.0 + auVar66._16_4_;
          auVar144._20_4_ = auVar111._20_4_ + -1.0 + auVar66._20_4_;
          auVar144._24_4_ = auVar111._24_4_ + -1.0 + auVar66._24_4_;
          auVar144._28_4_ = auVar111._28_4_ + -1.0 + auVar66._28_4_;
          auVar74 = vpsubd_avx(auVar74,auVar63._16_16_);
          auVar248._8_4_ = 0xffffff81;
          auVar248._0_8_ = 0xffffff81ffffff81;
          auVar248._12_4_ = 0xffffff81;
          auVar74 = vpaddd_avx(auVar74,auVar248);
          auVar113 = vpsubd_avx(auVar113,auVar63._0_16_);
          auVar113 = vpaddd_avx(auVar113,auVar248);
          auVar191._16_16_ = auVar74;
          auVar191._0_16_ = auVar113;
          auVar212._0_4_ = auVar144._0_4_ * auVar144._0_4_;
          auVar212._4_4_ = auVar144._4_4_ * auVar144._4_4_;
          auVar212._8_4_ = auVar144._8_4_ * auVar144._8_4_;
          auVar212._12_4_ = auVar144._12_4_ * auVar144._12_4_;
          auVar212._16_4_ = auVar144._16_4_ * auVar144._16_4_;
          auVar212._20_4_ = auVar144._20_4_ * auVar144._20_4_;
          auVar212._24_4_ = auVar144._24_4_ * auVar144._24_4_;
          auVar212._28_4_ = 0;
          auVar235._8_4_ = 0x3d9021bb;
          auVar235._0_8_ = 0x3d9021bb3d9021bb;
          auVar235._12_4_ = 0x3d9021bb;
          auVar235._16_4_ = 0x3d9021bb;
          auVar235._20_4_ = 0x3d9021bb;
          auVar235._24_4_ = 0x3d9021bb;
          auVar235._28_4_ = 0x3d9021bb;
          auVar265._8_4_ = 0xbdebd1b8;
          auVar265._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar265._12_4_ = 0xbdebd1b8;
          auVar265._16_4_ = 0xbdebd1b8;
          auVar265._20_4_ = 0xbdebd1b8;
          auVar265._24_4_ = 0xbdebd1b8;
          auVar265._28_4_ = 0xbdebd1b8;
          auVar74 = vfmadd213ps_fma(auVar235,auVar144,auVar265);
          auVar266._8_4_ = 0x3def251a;
          auVar266._0_8_ = 0x3def251a3def251a;
          auVar266._12_4_ = 0x3def251a;
          auVar266._16_4_ = 0x3def251a;
          auVar266._20_4_ = 0x3def251a;
          auVar266._24_4_ = 0x3def251a;
          auVar266._28_4_ = 0x3def251a;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar144,auVar266);
          auVar267._8_4_ = 0xbdfe5d4f;
          auVar267._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar267._12_4_ = 0xbdfe5d4f;
          auVar267._16_4_ = 0xbdfe5d4f;
          auVar267._20_4_ = 0xbdfe5d4f;
          auVar267._24_4_ = 0xbdfe5d4f;
          auVar267._28_4_ = 0xbdfe5d4f;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar144,auVar267);
          auVar268._8_4_ = 0x3e11e9bf;
          auVar268._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar268._12_4_ = 0x3e11e9bf;
          auVar268._16_4_ = 0x3e11e9bf;
          auVar268._20_4_ = 0x3e11e9bf;
          auVar268._24_4_ = 0x3e11e9bf;
          auVar268._28_4_ = 0x3e11e9bf;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar144,auVar268);
          auVar269._8_4_ = 0xbe2aae50;
          auVar269._0_8_ = 0xbe2aae50be2aae50;
          auVar269._12_4_ = 0xbe2aae50;
          auVar269._16_4_ = 0xbe2aae50;
          auVar269._20_4_ = 0xbe2aae50;
          auVar269._24_4_ = 0xbe2aae50;
          auVar269._28_4_ = 0xbe2aae50;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar144,auVar269);
          auVar270._8_4_ = 0x3e4cceac;
          auVar270._0_8_ = 0x3e4cceac3e4cceac;
          auVar270._12_4_ = 0x3e4cceac;
          auVar270._16_4_ = 0x3e4cceac;
          auVar270._20_4_ = 0x3e4cceac;
          auVar270._24_4_ = 0x3e4cceac;
          auVar270._28_4_ = 0x3e4cceac;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar144,auVar270);
          auVar271._8_4_ = 0xbe7ffffc;
          auVar271._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar271._12_4_ = 0xbe7ffffc;
          auVar271._16_4_ = 0xbe7ffffc;
          auVar271._20_4_ = 0xbe7ffffc;
          auVar271._24_4_ = 0xbe7ffffc;
          auVar271._28_4_ = 0xbe7ffffc;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar144,auVar271);
          auVar272._8_4_ = 0x3eaaaaaa;
          auVar272._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar272._12_4_ = 0x3eaaaaaa;
          auVar272._16_4_ = 0x3eaaaaaa;
          auVar272._20_4_ = 0x3eaaaaaa;
          auVar272._24_4_ = 0x3eaaaaaa;
          auVar272._28_4_ = 0x3eaaaaaa;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar144,auVar272);
          auVar236._0_4_ = auVar212._0_4_ * auVar144._0_4_ * auVar74._0_4_;
          auVar236._4_4_ = auVar212._4_4_ * auVar144._4_4_ * auVar74._4_4_;
          auVar236._8_4_ = auVar212._8_4_ * auVar144._8_4_ * auVar74._8_4_;
          auVar236._12_4_ = auVar212._12_4_ * auVar144._12_4_ * auVar74._12_4_;
          auVar236._16_4_ = auVar212._16_4_ * auVar144._16_4_ * 0.0;
          auVar236._20_4_ = auVar212._20_4_ * auVar144._20_4_ * 0.0;
          auVar236._24_4_ = auVar212._24_4_ * auVar144._24_4_ * 0.0;
          auVar236._28_4_ = 0;
          auVar63 = vcvtdq2ps_avx(auVar191);
          auVar74 = vfmadd231ps_fma(auVar236,auVar63,auVar313);
          auVar74 = vfmsub231ps_fma(ZEXT1632(auVar74),auVar326,auVar212);
          auVar66 = vcmpps_avx(ZEXT1632(auVar202),ZEXT432(0) << 0x20,2);
          auVar111 = vsubps_avx(ZEXT1632(auVar74),auVar144);
          auVar74 = vfmsub231ps_fma(auVar111,auVar343,auVar63);
          auVar237._8_4_ = 0xc0000000;
          auVar237._0_8_ = 0xc0000000c0000000;
          auVar237._12_4_ = 0xc0000000;
          auVar237._16_4_ = 0xc0000000;
          auVar237._20_4_ = 0xc0000000;
          auVar237._24_4_ = 0xc0000000;
          auVar237._28_4_ = 0xc0000000;
          auVar145._0_4_ = auVar74._0_4_ * -2.0;
          auVar145._4_4_ = auVar74._4_4_ * -2.0;
          auVar145._8_4_ = auVar74._8_4_ * -2.0;
          auVar145._12_4_ = auVar74._12_4_ * -2.0;
          auVar145._16_4_ = 0x80000000;
          auVar145._20_4_ = 0x80000000;
          auVar145._24_4_ = 0x80000000;
          auVar145._28_4_ = 0;
          auVar192._8_4_ = 0x7fffffff;
          auVar192._0_8_ = 0x7fffffff7fffffff;
          auVar192._12_4_ = 0x7fffffff;
          auVar192._16_4_ = 0x7fffffff;
          auVar192._20_4_ = 0x7fffffff;
          auVar192._24_4_ = 0x7fffffff;
          auVar192._28_4_ = 0x7fffffff;
          auVar66 = vblendvps_avx(auVar145,auVar192,auVar66);
          auVar146._8_4_ = 0x42b0c0a5;
          auVar146._0_8_ = 0x42b0c0a542b0c0a5;
          auVar146._12_4_ = 0x42b0c0a5;
          auVar146._16_4_ = 0x42b0c0a5;
          auVar146._20_4_ = 0x42b0c0a5;
          auVar146._24_4_ = 0x42b0c0a5;
          auVar146._28_4_ = 0x42b0c0a5;
          auVar66 = vminps_avx(auVar66,auVar146);
          auVar147._8_4_ = 0xc2b0c0a5;
          auVar147._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar147._12_4_ = 0xc2b0c0a5;
          auVar147._16_4_ = 0xc2b0c0a5;
          auVar147._20_4_ = 0xc2b0c0a5;
          auVar147._24_4_ = 0xc2b0c0a5;
          auVar147._28_4_ = 0xc2b0c0a5;
          auVar63 = vmaxps_avx(auVar66,auVar147);
          auVar148._8_4_ = 0x3fb8aa3b;
          auVar148._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar148._12_4_ = 0x3fb8aa3b;
          auVar148._16_4_ = 0x3fb8aa3b;
          auVar148._20_4_ = 0x3fb8aa3b;
          auVar148._24_4_ = 0x3fb8aa3b;
          auVar148._28_4_ = 0x3fb8aa3b;
          auVar74 = vfmadd213ps_fma(auVar148,auVar63,auVar326);
          auVar111 = vroundps_avx(ZEXT1632(auVar74),1);
          auVar66 = vcmpps_avx(ZEXT1632(auVar74),auVar111,1);
          auVar66 = vandps_avx(auVar337,auVar66);
          auVar66 = vsubps_avx(auVar111,auVar66);
          auVar74 = vfmsub231ps_fma(auVar63,auVar66,auVar343);
          auVar113 = vfnmsub231ps_fma(ZEXT1632(auVar74),auVar66,auVar313);
          auVar63 = ZEXT1632(auVar113);
          auVar21._28_4_ = auVar111._28_4_;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar113._12_4_ * auVar113._12_4_,
                                  CONCAT48(auVar113._8_4_ * auVar113._8_4_,
                                           CONCAT44(auVar113._4_4_ * auVar113._4_4_,
                                                    auVar113._0_4_ * auVar113._0_4_))));
          auVar74 = vfmadd213ps_fma(auVar355,auVar63,auVar350);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar360);
          auVar273._8_4_ = 0x3d2aa9c1;
          auVar273._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar273._12_4_ = 0x3d2aa9c1;
          auVar273._16_4_ = 0x3d2aa9c1;
          auVar273._20_4_ = 0x3d2aa9c1;
          auVar273._24_4_ = 0x3d2aa9c1;
          auVar273._28_4_ = 0x3d2aa9c1;
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar273);
          auVar274._8_4_ = 0x3e2aaaaa;
          auVar274._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar274._12_4_ = 0x3e2aaaaa;
          auVar274._16_4_ = 0x3e2aaaaa;
          auVar274._20_4_ = 0x3e2aaaaa;
          auVar274._24_4_ = 0x3e2aaaaa;
          auVar274._28_4_ = 0x3e2aaaaa;
          auVar63 = ZEXT1632(auVar113);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar274);
          auVar74 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar63,auVar326);
          auVar202 = vfmadd213ps_fma(ZEXT1632(auVar74),auVar21,auVar63);
          auVar75._0_4_ = (int)auVar66._0_4_;
          auVar75._4_4_ = (int)auVar66._4_4_;
          auVar75._8_4_ = (int)auVar66._8_4_;
          auVar75._12_4_ = (int)auVar66._12_4_;
          auVar94._16_4_ = (int)auVar66._16_4_;
          auVar94._0_16_ = auVar75;
          auVar94._20_4_ = (int)auVar66._20_4_;
          auVar94._24_4_ = (int)auVar66._24_4_;
          auVar94._28_4_ = (int)auVar66._28_4_;
          auVar113 = vpslld_avx(auVar75,0x17);
          auVar74 = vpslld_avx(auVar94._16_16_,0x17);
          auVar74 = vpaddd_avx(auVar74,auVar295);
          auVar113 = vpaddd_avx(auVar113,auVar295);
          auVar95._16_16_ = auVar74;
          auVar95._0_16_ = auVar113;
          auVar149._0_4_ = auVar202._0_4_ + 1.0;
          auVar149._4_4_ = auVar202._4_4_ + 1.0;
          auVar149._8_4_ = auVar202._8_4_ + 1.0;
          auVar149._12_4_ = auVar202._12_4_ + 1.0;
          auVar149._16_4_ = 0x3f800000;
          auVar149._20_4_ = 0x3f800000;
          auVar149._24_4_ = 0x3f800000;
          auVar149._28_4_ = 0x3f800000;
          auVar74 = vfmadd213ps_fma(auVar95,auVar149,auVar337);
          auVar66 = vdivps_avx(auVar337,ZEXT1632(auVar74));
          auVar74 = vfnmadd213ps_fma(auVar66,auVar237,auVar333);
          auVar71 = ZEXT1664(auVar74);
          goto LAB_002c2990;
        case 6:
          puVar15 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar3 = *puVar15;
          auVar101._4_4_ = uVar3;
          auVar101._0_4_ = uVar3;
          auVar101._8_4_ = uVar3;
          auVar101._12_4_ = uVar3;
          auVar101._16_4_ = uVar3;
          auVar101._20_4_ = uVar3;
          auVar101._24_4_ = uVar3;
          auVar101._28_4_ = uVar3;
          uVar3 = puVar15[1];
          auVar153._4_4_ = uVar3;
          auVar153._0_4_ = uVar3;
          auVar153._8_4_ = uVar3;
          auVar153._12_4_ = uVar3;
          auVar153._16_4_ = uVar3;
          auVar153._20_4_ = uVar3;
          auVar153._24_4_ = uVar3;
          auVar153._28_4_ = uVar3;
          auVar74 = vfmadd231ps_fma(auVar153,auVar61,auVar101);
          auVar66 = vmaxps_avx(ZEXT1632(auVar74),ZEXT832(0) << 0x20);
          auVar154._8_4_ = 0x3f800000;
          auVar154._0_8_ = 0x3f8000003f800000;
          auVar154._12_4_ = 0x3f800000;
          auVar154._16_4_ = 0x3f800000;
          auVar154._20_4_ = 0x3f800000;
          auVar154._24_4_ = 0x3f800000;
          auVar154._28_4_ = 0x3f800000;
          auVar66 = vminps_avx(auVar66,auVar154);
          auVar71 = ZEXT3264(auVar66);
LAB_002c2990:
          auVar357._0_4_ = auVar71._0_4_ * fVar51;
          auVar357._4_4_ = auVar71._4_4_ * fVar72;
          auVar357._8_4_ = auVar71._8_4_ * auVar61._8_4_;
          auVar357._12_4_ = auVar71._12_4_ * auVar61._12_4_;
          auVar357._16_4_ = auVar71._16_4_ * auVar61._16_4_;
          auVar357._20_4_ = auVar71._20_4_ * auVar61._20_4_;
          auVar357._28_36_ = auVar71._28_36_;
          auVar357._24_4_ = auVar71._24_4_ * auVar61._24_4_;
          auVar66 = auVar357._0_32_;
        }
switchD_002c2551_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar32 * 0x20) = auVar66;
      }
      goto LAB_002c44fa;
    }
    iVar48 = 0;
  }
LAB_002c44fa:
  if (piStack_350 != (int *)0x0) {
    LOCK();
    *piStack_350 = *piStack_350 + -1;
    UNLOCK();
    if (*piStack_350 == 0) {
      if (local_338 == (Allocator *)0x0) {
        free(local_358);
      }
      else {
        (*local_338->_vptr_Allocator[3])();
      }
    }
  }
  return iVar48;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}